

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

vbool<4> __thiscall
embree::avx2::InstanceArrayIntersectorKMB<4>::occluded
          (InstanceArrayIntersectorKMB<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  undefined8 uVar16;
  _func_int *p_Var17;
  ulong uVar18;
  Geometry *extraout_RDX;
  Geometry *pGVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar130;
  float fVar131;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar132;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 in_ZMM4 [64];
  float fVar187;
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar211;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar207;
  float fVar209;
  undefined1 in_ZMM5 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [64];
  float fVar335;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar344;
  undefined1 auVar341 [16];
  float fVar342;
  float fVar343;
  undefined1 in_ZMM14 [64];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar352;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 in_ZMM15 [64];
  vbool<4> vVar353;
  RayQueryContext newcontext;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  undefined8 uStack_310;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  RTCIntersectArguments *local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar16 = mm_lookupmask_ps._8_8_;
  auVar35 = in_ZMM6._0_16_;
  auVar34 = in_ZMM4._0_16_;
  auVar114 = in_ZMM12._0_16_;
  auVar33 = in_ZMM5._0_16_;
  uVar3 = prim->primID_;
  uVar21 = prim->instID_;
  pGVar19 = (context->scene->geometries).items[uVar21].ptr;
  p_Var17 = *(_func_int **)&pGVar19->field_0x58;
  if ((p_Var17 != (_func_int *)0x0) ||
     ((uVar18 = (ulong)*(uint *)(*(long *)&pGVar19[1].time_range.upper +
                                (long)pGVar19[1].intersectionFilterN * (ulong)uVar3),
      uVar18 != 0xffffffff &&
      (p_Var17 = pGVar19[1].super_RefCount._vptr_RefCount[uVar18], p_Var17 != (_func_int *)0x0)))) {
    uVar20 = pGVar19->mask;
    auVar53._4_4_ = uVar20;
    auVar53._0_4_ = uVar20;
    auVar53._8_4_ = uVar20;
    auVar53._12_4_ = uVar20;
    auVar53 = vpand_avx(auVar53,*(undefined1 (*) [16])(ray + 0x90));
    auVar53 = vpcmpeqd_avx(auVar53,(undefined1  [16])0x0);
    local_38 = vpandn_avx(auVar53,(undefined1  [16])valid_i->field_0);
    auVar334 = ZEXT1664(local_38);
    uVar20 = vmovmskps_avx(local_38);
    if (uVar20 != 0) {
      pRVar5 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar16;
      if (pRVar5->instID[0] == 0xffffffff) {
        pRVar5->instID[0] = uVar21;
        pRVar5->instPrimID[0] = uVar3;
        uVar18 = (ulong)prim->primID_;
        auVar53 = local_38;
        if ((pGVar19->field_8).field_0x1 == '\x01') {
          fVar102 = (pGVar19->time_range).lower;
          auVar33._4_4_ = fVar102;
          auVar33._0_4_ = fVar102;
          auVar33._8_4_ = fVar102;
          auVar33._12_4_ = fVar102;
          fVar130 = pGVar19->fnumTimeSegments;
          auVar33 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar33);
          fVar102 = (pGVar19->time_range).upper - fVar102;
          auVar34._4_4_ = fVar102;
          auVar34._0_4_ = fVar102;
          auVar34._8_4_ = fVar102;
          auVar34._12_4_ = fVar102;
          auVar34 = vdivps_avx(auVar33,auVar34);
          auVar35._0_4_ = fVar130 * auVar34._0_4_;
          auVar35._4_4_ = fVar130 * auVar34._4_4_;
          auVar35._8_4_ = fVar130 * auVar34._8_4_;
          auVar35._12_4_ = fVar130 * auVar34._12_4_;
          auVar34 = vroundps_avx(auVar35,1);
          fVar130 = fVar130 + -1.0;
          auVar114._4_4_ = fVar130;
          auVar114._0_4_ = fVar130;
          auVar114._8_4_ = fVar130;
          auVar114._12_4_ = fVar130;
          auVar34 = vminps_avx(auVar34,auVar114);
          auVar34 = vmaxps_avx(auVar34,ZEXT416(0) << 0x20);
          auVar35 = vsubps_avx(auVar35,auVar34);
          local_108 = vcvtps2dq_avx(auVar34);
          uVar3 = 0;
          for (uVar21 = uVar20 & 0xff; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
            uVar3 = uVar3 + 1;
          }
          iVar4 = *(int *)(local_108 + (ulong)uVar3 * 4);
          auVar56._4_4_ = iVar4;
          auVar56._0_4_ = iVar4;
          auVar56._8_4_ = iVar4;
          auVar56._12_4_ = iVar4;
          auVar34 = vpcmpeqd_avx(local_108,auVar56);
          auVar114 = local_38 & ~auVar34;
          fVar102 = auVar35._0_4_;
          fVar130 = auVar35._4_4_;
          fVar131 = auVar35._8_4_;
          fVar132 = auVar35._12_4_;
          if ((((auVar114 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar114 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar114 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar114[0xf]) {
            plVar2 = (long *)(*(long *)&pGVar19[1].fnumTimeSegments + (long)iVar4 * 0x38);
            iVar4 = *(int *)(*(long *)&pGVar19[1].fnumTimeSegments + 0x20 + (long)iVar4 * 0x38);
            if (iVar4 == 0x9134) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
              local_108 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
              auVar114 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
              auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
              auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar36,0x4c);
              local_108 = vshufps_avx(auVar33,auVar33,0x78);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar57,0x4c);
              auVar114 = vshufps_avx(auVar33,auVar33,0x78);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar58,0x4c);
              auVar33 = vshufps_avx(auVar33,auVar33,0x78);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
              auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar59,0x4c);
              auVar34 = vshufps_avx(auVar34,auVar34,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar33 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
              auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar38);
              auVar114 = vshufps_avx(auVar34,auVar38,0xd8);
              auVar153._8_8_ = 0;
              auVar153._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar153);
              auVar56 = vshufps_avx(auVar34,auVar153,0xd8);
              fVar335 = *(float *)(lVar6 + 0x24 + lVar22);
              fVar342 = *(float *)(lVar6 + 0x28 + lVar22);
              fVar343 = *(float *)(lVar6 + 0x2c + lVar22);
              fVar344 = *(float *)(lVar6 + 0x30 + lVar22);
              auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar342 * fVar342)),ZEXT416((uint)fVar335),
                                        ZEXT416((uint)fVar335));
              auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar343),ZEXT416((uint)fVar343));
              auVar79 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar344),ZEXT416((uint)fVar344));
              auVar34 = vrsqrtss_avx(auVar79,auVar79);
              fVar187 = auVar34._0_4_;
              fVar187 = fVar187 * 1.5 + fVar187 * fVar187 * fVar187 * auVar79._0_4_ * -0.5;
              auVar34 = vinsertps_avx(auVar56,ZEXT416((uint)(fVar187 * fVar335)),0x30);
              local_108 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar187 * fVar342)),0x30);
              auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
              auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar187 * fVar344)),0x30);
              auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
              auVar114 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar187 * fVar343)),0x30);
            }
            else {
              auVar114 = auVar35;
              if (iVar4 == 0x9244) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                local_108 = *(undefined1 (*) [16])(lVar6 + lVar22);
                auVar114 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                auVar33 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
                auVar34 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
              }
            }
            uVar23 = local_108._0_4_;
            auVar193._4_4_ = uVar23;
            auVar193._0_4_ = uVar23;
            auVar193._8_4_ = uVar23;
            auVar193._12_4_ = uVar23;
            auVar56 = vshufps_avx(local_108,local_108,0x55);
            auVar79 = vshufps_avx(local_108,local_108,0xaa);
            auVar80 = vshufps_avx(local_108,local_108,0xff);
            uVar23 = auVar114._0_4_;
            auVar217._4_4_ = uVar23;
            auVar217._0_4_ = uVar23;
            auVar217._8_4_ = uVar23;
            auVar217._12_4_ = uVar23;
            auVar81 = vshufps_avx(auVar114,auVar114,0x55);
            auVar82 = vshufps_avx(auVar114,auVar114,0xaa);
            auVar114 = vshufps_avx(auVar114,auVar114,0xff);
            uVar23 = auVar33._0_4_;
            auVar232._4_4_ = uVar23;
            auVar232._0_4_ = uVar23;
            auVar232._8_4_ = uVar23;
            auVar232._12_4_ = uVar23;
            auVar83 = vshufps_avx(auVar33,auVar33,0x55);
            auVar84 = vshufps_avx(auVar33,auVar33,0xaa);
            auVar33 = vshufps_avx(auVar33,auVar33,0xff);
            local_368._4_4_ = auVar34._0_4_;
            auVar253 = vshufps_avx(auVar34,auVar34,0x55);
            auVar292 = vshufps_avx(auVar34,auVar34,0xaa);
            auVar34 = vshufps_avx(auVar34,auVar34,0xff);
            iVar4 = (int)plVar2[0xb];
            local_368._0_4_ = local_368._4_4_;
            fStack_360 = (float)local_368._4_4_;
            fStack_35c = (float)local_368._4_4_;
            if (iVar4 == 0x9134) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar85 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
              auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
              auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
              auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
              auVar88 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
              auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
              auVar85 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar60,0x4c);
              auVar85 = vshufps_avx(auVar85,auVar85,0x78);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar61,0x4c);
              auVar86 = vshufps_avx(auVar86,auVar86,0x78);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar87 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar62,0x4c);
              auVar87 = vshufps_avx(auVar87,auVar87,0x78);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
              auVar88 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar63,0x4c);
              auVar88 = vshufps_avx(auVar88,auVar88,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar86 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
              auVar115._8_8_ = 0;
              auVar115._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
              auVar85 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar115);
              auVar87 = vshufps_avx(auVar85,auVar115,0xd8);
              auVar194._8_8_ = 0;
              auVar194._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar85 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar194);
              auVar88 = vshufps_avx(auVar85,auVar194,0xd8);
              fVar335 = *(float *)(lVar6 + 0x24 + lVar22);
              fVar342 = *(float *)(lVar6 + 0x28 + lVar22);
              fVar343 = *(float *)(lVar6 + 0x2c + lVar22);
              fVar344 = *(float *)(lVar6 + 0x30 + lVar22);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar342 * fVar342)),ZEXT416((uint)fVar335),
                                        ZEXT416((uint)fVar335));
              auVar85 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar343),ZEXT416((uint)fVar343));
              auVar140 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar344),ZEXT416((uint)fVar344));
              auVar85 = vrsqrtss_avx(auVar140,auVar140);
              fVar187 = auVar85._0_4_;
              fVar187 = fVar187 * 1.5 + fVar187 * fVar187 * fVar187 * auVar140._0_4_ * -0.5;
              auVar88 = vinsertps_avx(auVar88,ZEXT416((uint)(fVar187 * fVar335)),0x30);
              auVar85 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar187 * fVar342)),0x30);
              auVar140 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
              auVar87 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar344 * fVar187)),0x30);
              auVar86 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
              auVar86 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar187 * fVar343)),0x30);
            }
            else {
              auVar85 = auVar292;
              auVar86 = auVar232;
              auVar87 = auVar217;
              auVar88 = auVar193;
              if (iVar4 == 0x9244) {
                lVar6 = plVar2[7];
                lVar22 = uVar18 * plVar2[9];
                auVar85 = *(undefined1 (*) [16])(lVar6 + lVar22);
                auVar86 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                auVar87 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
                auVar88 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
              }
            }
            auVar322 = vshufps_avx(auVar85,auVar85,0xff);
            auVar141 = vshufps_avx(auVar88,auVar88,0xff);
            local_338._0_4_ = auVar80._0_4_;
            local_338._4_4_ = auVar80._4_4_;
            uStack_330._0_4_ = auVar80._8_4_;
            uStack_330._4_4_ = auVar80._12_4_;
            auVar89 = vshufps_avx(auVar86,auVar86,0xff);
            auVar90 = vshufps_avx(auVar87,auVar87,0xff);
            auVar233._0_4_ =
                 auVar33._0_4_ * auVar90._0_4_ +
                 auVar114._0_4_ * auVar89._0_4_ +
                 auVar322._0_4_ * (float)local_338._0_4_ + auVar34._0_4_ * auVar141._0_4_;
            auVar233._4_4_ =
                 auVar33._4_4_ * auVar90._4_4_ +
                 auVar114._4_4_ * auVar89._4_4_ +
                 auVar322._4_4_ * (float)local_338._4_4_ + auVar34._4_4_ * auVar141._4_4_;
            auVar233._8_4_ =
                 auVar33._8_4_ * auVar90._8_4_ +
                 auVar114._8_4_ * auVar89._8_4_ +
                 auVar322._8_4_ * (float)uStack_330 + auVar34._8_4_ * auVar141._8_4_;
            auVar233._12_4_ =
                 auVar33._12_4_ * auVar90._12_4_ +
                 auVar114._12_4_ * auVar89._12_4_ +
                 auVar322._12_4_ * uStack_330._4_4_ + auVar34._12_4_ * auVar141._12_4_;
            uVar18 = CONCAT44(auVar233._4_4_,auVar233._0_4_);
            auVar218._0_8_ = uVar18 ^ 0x8000000080000000;
            auVar218._8_4_ = -auVar233._8_4_;
            auVar218._12_4_ = -auVar233._12_4_;
            auVar140 = vcmpps_avx(auVar233,auVar218,1);
            auVar263._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
            auVar263._8_4_ = -auVar141._8_4_;
            auVar263._12_4_ = -auVar141._12_4_;
            auVar141 = vblendvps_avx(auVar141,auVar263,auVar140);
            auVar116._0_8_ = auVar322._0_8_ ^ 0x8000000080000000;
            auVar116._8_4_ = -auVar322._8_4_;
            auVar116._12_4_ = -auVar322._12_4_;
            auVar322 = vblendvps_avx(auVar322,auVar116,auVar140);
            auVar65._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
            auVar65._8_4_ = -auVar89._8_4_;
            auVar65._12_4_ = -auVar89._12_4_;
            auVar89 = vblendvps_avx(auVar89,auVar65,auVar140);
            auVar66._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar66._8_4_ = -auVar90._8_4_;
            auVar66._12_4_ = -auVar90._12_4_;
            auVar90 = vblendvps_avx(auVar90,auVar66,auVar140);
            auVar48 = vmaxps_avx(auVar218,auVar233);
            auVar67._8_4_ = 0x7fffffff;
            auVar67._0_8_ = 0x7fffffff7fffffff;
            auVar67._12_4_ = 0x7fffffff;
            auVar140 = vandps_avx(auVar233,auVar67);
            fVar335 = auVar140._0_4_;
            fVar342 = auVar140._4_4_;
            fVar343 = auVar140._8_4_;
            fVar344 = auVar140._12_4_;
            auVar39._8_4_ = 0x3f800000;
            auVar39._0_8_ = 0x3f8000003f800000;
            auVar39._12_4_ = 0x3f800000;
            auVar91 = vsubps_avx(auVar39,auVar140);
            auVar91 = vsqrtps_avx(auVar91);
            auVar117._0_4_ =
                 auVar91._0_4_ *
                 (fVar335 * (fVar335 * (fVar335 * (fVar335 * (fVar335 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._4_4_ =
                 auVar91._4_4_ *
                 (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._8_4_ =
                 auVar91._8_4_ *
                 (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._12_4_ =
                 auVar91._12_4_ *
                 (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar154._8_4_ = 0x3fc90fdb;
            auVar154._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar154._12_4_ = 0x3fc90fdb;
            auVar91 = vsubps_avx(auVar154,auVar117);
            auVar92 = vmaxps_avx(ZEXT816(0) << 0x20,auVar91);
            auVar91 = vcmpps_avx(auVar48,ZEXT816(0) << 0x20,1);
            auVar234._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar234._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar234._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar91 = vblendvps_avx(auVar92,auVar234,auVar91);
            auVar140 = vcmpps_avx(auVar140,auVar39,6);
            auVar91 = vsubps_avx(auVar154,auVar91);
            auVar195._8_4_ = 0x7fc00000;
            auVar195._0_8_ = 0x7fc000007fc00000;
            auVar195._12_4_ = 0x7fc00000;
            auVar140 = vblendvps_avx(auVar91,auVar195,auVar140);
            auVar68._0_4_ = fVar102 * auVar140._0_4_;
            auVar68._4_4_ = fVar130 * auVar140._4_4_;
            auVar68._8_4_ = fVar131 * auVar140._8_4_;
            auVar68._12_4_ = fVar132 * auVar140._12_4_;
            auVar118._0_4_ = auVar68._0_4_ * 0.63661975;
            auVar118._4_4_ = auVar68._4_4_ * 0.63661975;
            auVar118._8_4_ = auVar68._8_4_ * 0.63661975;
            auVar118._12_4_ = auVar68._12_4_ * 0.63661975;
            auVar140 = vroundps_avx(auVar118,1);
            auVar155._0_4_ = auVar140._0_4_ * 1.5707964;
            auVar155._4_4_ = auVar140._4_4_ * 1.5707964;
            auVar155._8_4_ = auVar140._8_4_ * 1.5707964;
            auVar155._12_4_ = auVar140._12_4_ * 1.5707964;
            auVar91 = vsubps_avx(auVar68,auVar155);
            fVar335 = auVar91._0_4_;
            fVar187 = fVar335 * fVar335;
            fVar342 = auVar91._4_4_;
            fVar207 = fVar342 * fVar342;
            fVar343 = auVar91._8_4_;
            fVar209 = fVar343 * fVar343;
            fVar344 = auVar91._12_4_;
            fVar211 = fVar344 * fVar344;
            auVar156._0_4_ =
                 fVar335 * ((fVar187 * (fVar187 * (fVar187 * (fVar187 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar187 + 1.0);
            auVar156._4_4_ =
                 fVar342 * ((fVar207 * (fVar207 * (fVar207 * (fVar207 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar207 + 1.0);
            auVar156._8_4_ =
                 fVar343 * ((fVar209 * (fVar209 * (fVar209 * (fVar209 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar209 + 1.0);
            auVar156._12_4_ =
                 fVar344 * ((fVar211 * (fVar211 * (fVar211 * (fVar211 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar211 + 1.0);
            auVar47 = vcvtps2dq_avx(auVar140);
            auVar338._8_4_ = 1;
            auVar338._0_8_ = 0x100000001;
            auVar338._12_4_ = 1;
            auVar140 = vandpd_avx(auVar338,auVar47);
            auVar92 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x20);
            auVar140 = vpsubd_avx(ZEXT816(0) << 0x20,auVar140);
            auVar196._0_4_ =
                 fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar196._4_4_ =
                 fVar207 * (fVar207 * (fVar207 * (fVar207 * (fVar207 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar196._8_4_ =
                 fVar209 * (fVar209 * (fVar209 * (fVar209 * (fVar209 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar196._12_4_ =
                 fVar211 * (fVar211 * (fVar211 * (fVar211 * (fVar211 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar91 = vblendvps_avx(auVar156,auVar196,auVar140);
            auVar92 = vblendvps_avx(auVar156,auVar196,auVar92);
            auVar197._8_4_ = 3;
            auVar197._0_8_ = 0x300000003;
            auVar197._12_4_ = 3;
            auVar140 = vandpd_avx(auVar47,auVar197);
            auVar47 = vpcmpeqd_avx(auVar47,auVar47);
            auVar47 = vpaddd_avx(auVar140,auVar47);
            auVar49 = vpminud_avx(auVar47,auVar338);
            auVar47 = vpcmpeqd_avx(auVar49,auVar47);
            auVar248._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar248._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar248._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar92 = vblendvps_avx(auVar92,auVar248,auVar47);
            auVar140 = vpcmpgtd_avx(auVar140,auVar338);
            auVar134._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
            auVar134._8_4_ = auVar91._8_4_ ^ 0x80000000;
            auVar134._12_4_ = auVar91._12_4_ ^ 0x80000000;
            auVar140 = vblendvps_avx(auVar134,auVar91,auVar140);
            auVar91 = vfmsub213ps_fma(auVar34,auVar48,auVar141);
            auVar47 = vfmsub213ps_fma(auVar80,auVar48,auVar322);
            fVar335 = auVar91._0_4_;
            fVar209 = auVar91._4_4_;
            fVar212 = auVar91._8_4_;
            fVar10 = auVar91._12_4_;
            fVar342 = auVar47._0_4_;
            fVar211 = auVar47._4_4_;
            fVar7 = auVar47._8_4_;
            fVar11 = auVar47._12_4_;
            auVar91 = vfmsub213ps_fma(auVar114,auVar48,auVar89);
            fVar343 = auVar91._0_4_;
            fVar188 = auVar91._4_4_;
            fVar8 = auVar91._8_4_;
            fVar12 = auVar91._12_4_;
            auVar91 = vfmsub213ps_fma(auVar33,auVar48,auVar90);
            fVar344 = auVar91._0_4_;
            fVar208 = auVar91._4_4_;
            fVar9 = auVar91._8_4_;
            fVar13 = auVar91._12_4_;
            auVar69._0_4_ =
                 fVar344 * fVar344 + fVar343 * fVar343 + fVar342 * fVar342 + fVar335 * fVar335;
            auVar69._4_4_ =
                 fVar208 * fVar208 + fVar188 * fVar188 + fVar211 * fVar211 + fVar209 * fVar209;
            auVar69._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar7 * fVar7 + fVar212 * fVar212;
            auVar69._12_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10;
            auVar91 = vrsqrtps_avx(auVar69);
            fVar187 = auVar91._0_4_;
            fVar207 = auVar91._4_4_;
            fVar210 = auVar91._8_4_;
            fVar352 = auVar91._12_4_;
            auVar70._0_4_ = fVar187 * fVar187 * fVar187 * auVar69._0_4_ * -0.5;
            auVar70._4_4_ = fVar207 * fVar207 * fVar207 * auVar69._4_4_ * -0.5;
            auVar70._8_4_ = fVar210 * fVar210 * fVar210 * auVar69._8_4_ * -0.5;
            auVar70._12_4_ = fVar352 * fVar352 * fVar352 * auVar69._12_4_ * -0.5;
            auVar135._8_4_ = 0x3fc00000;
            auVar135._0_8_ = 0x3fc000003fc00000;
            auVar135._12_4_ = 0x3fc00000;
            auVar91 = vfmadd231ps_fma(auVar70,auVar135,auVar91);
            fVar187 = auVar91._0_4_;
            fVar210 = auVar91._4_4_;
            fVar352 = auVar91._8_4_;
            fVar14 = auVar91._12_4_;
            fVar207 = auVar140._0_4_;
            auVar119._0_4_ = fVar335 * fVar187 * fVar207;
            fVar335 = auVar140._4_4_;
            auVar119._4_4_ = fVar209 * fVar210 * fVar335;
            fVar209 = auVar140._8_4_;
            auVar119._8_4_ = fVar212 * fVar352 * fVar209;
            fVar212 = auVar140._12_4_;
            auVar119._12_4_ = fVar10 * fVar14 * fVar212;
            auVar198._0_4_ = fVar342 * fVar187 * fVar207;
            auVar198._4_4_ = fVar211 * fVar210 * fVar335;
            auVar198._8_4_ = fVar7 * fVar352 * fVar209;
            auVar198._12_4_ = fVar11 * fVar14 * fVar212;
            auVar339._0_4_ = fVar343 * fVar187 * fVar207;
            auVar339._4_4_ = fVar188 * fVar210 * fVar335;
            auVar339._8_4_ = fVar8 * fVar352 * fVar209;
            auVar339._12_4_ = fVar12 * fVar14 * fVar212;
            auVar235._0_4_ = fVar344 * fVar187 * fVar207;
            auVar235._4_4_ = fVar208 * fVar210 * fVar335;
            auVar235._8_4_ = fVar9 * fVar352 * fVar209;
            auVar235._12_4_ = fVar13 * fVar14 * fVar212;
            auVar91 = vfmadd231ps_fma(auVar119,auVar92,auVar34);
            auVar47 = vfmadd231ps_fma(auVar198,auVar92,auVar80);
            auVar49 = vfmadd231ps_fma(auVar339,auVar92,auVar114);
            auVar92 = vfmadd231ps_fma(auVar235,auVar33,auVar92);
            auVar140 = vsubps_avx(auVar141,auVar34);
            auVar140 = vfmadd213ps_fma(auVar140,auVar35,auVar34);
            auVar34 = vsubps_avx(auVar322,auVar80);
            auVar80 = vfmadd213ps_fma(auVar34,auVar35,auVar80);
            auVar34 = vsubps_avx(auVar89,auVar114);
            auVar114 = vfmadd213ps_fma(auVar34,auVar35,auVar114);
            auVar34 = vsubps_avx(auVar90,auVar33);
            auVar33 = vfmadd213ps_fma(auVar34,auVar35,auVar33);
            fVar335 = auVar140._0_4_;
            fVar207 = auVar140._4_4_;
            fVar210 = auVar140._8_4_;
            fVar352 = auVar140._12_4_;
            fVar342 = auVar80._0_4_;
            fVar209 = auVar80._4_4_;
            fVar212 = auVar80._8_4_;
            fVar10 = auVar80._12_4_;
            fVar343 = auVar114._0_4_;
            fVar211 = auVar114._4_4_;
            fVar7 = auVar114._8_4_;
            fVar11 = auVar114._12_4_;
            fVar344 = auVar33._0_4_;
            fVar188 = auVar33._4_4_;
            fVar8 = auVar33._8_4_;
            fVar12 = auVar33._12_4_;
            auVar40._0_4_ =
                 fVar344 * fVar344 + fVar343 * fVar343 + fVar342 * fVar342 + fVar335 * fVar335;
            auVar40._4_4_ =
                 fVar188 * fVar188 + fVar211 * fVar211 + fVar209 * fVar209 + fVar207 * fVar207;
            auVar40._8_4_ = fVar8 * fVar8 + fVar7 * fVar7 + fVar212 * fVar212 + fVar210 * fVar210;
            auVar40._12_4_ = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10 + fVar352 * fVar352
            ;
            auVar33 = vrsqrtps_avx(auVar40);
            fVar187 = auVar33._0_4_;
            fVar208 = auVar33._4_4_;
            fVar9 = auVar33._8_4_;
            fVar13 = auVar33._12_4_;
            auVar273._0_4_ = fVar187 * fVar187 * auVar40._0_4_ * -0.5 * fVar187;
            auVar273._4_4_ = fVar208 * fVar208 * auVar40._4_4_ * -0.5 * fVar208;
            auVar273._8_4_ = fVar9 * fVar9 * auVar40._8_4_ * -0.5 * fVar9;
            auVar273._12_4_ = fVar13 * fVar13 * auVar40._12_4_ * -0.5 * fVar13;
            auVar33 = vfmadd231ps_fma(auVar273,auVar33,auVar135);
            fVar187 = auVar33._0_4_;
            auVar41._0_4_ = fVar187 * fVar335;
            fVar335 = auVar33._4_4_;
            auVar41._4_4_ = fVar335 * fVar207;
            fVar207 = auVar33._8_4_;
            auVar41._8_4_ = fVar207 * fVar210;
            fVar208 = auVar33._12_4_;
            auVar41._12_4_ = fVar208 * fVar352;
            auVar71._0_4_ = fVar187 * fVar342;
            auVar71._4_4_ = fVar335 * fVar209;
            auVar71._8_4_ = fVar207 * fVar212;
            auVar71._12_4_ = fVar208 * fVar10;
            auVar157._0_4_ = fVar343 * fVar187;
            auVar157._4_4_ = fVar211 * fVar335;
            auVar157._8_4_ = fVar7 * fVar207;
            auVar157._12_4_ = fVar11 * fVar208;
            auVar249._0_4_ = fVar344 * fVar187;
            auVar249._4_4_ = fVar188 * fVar335;
            auVar249._8_4_ = fVar8 * fVar207;
            auVar249._12_4_ = fVar12 * fVar208;
            auVar136._8_4_ = 0x3f7fdf3b;
            auVar136._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar136._12_4_ = 0x3f7fdf3b;
            auVar80 = vcmpps_avx(auVar48,auVar136,6);
            auVar33 = vblendvps_avx(auVar91,auVar41,auVar80);
            auVar34 = vblendvps_avx(auVar47,auVar71,auVar80);
            auVar114 = vblendvps_avx(auVar49,auVar157,auVar80);
            auVar80 = vblendvps_avx(auVar92,auVar249,auVar80);
            auVar120._8_4_ = 0x3f800000;
            auVar120._0_8_ = 0x3f8000003f800000;
            auVar120._12_4_ = 0x3f800000;
            auVar140 = vsubps_avx(auVar120,auVar35);
            fVar335 = auVar85._0_4_;
            auVar158._0_4_ = fVar102 * fVar335;
            auVar158._4_4_ = fVar130 * fVar335;
            auVar158._8_4_ = fVar131 * fVar335;
            auVar158._12_4_ = fVar132 * fVar335;
            auVar141 = vfmadd213ps_fma(auVar193,auVar140,auVar158);
            auVar35 = vshufps_avx(auVar85,auVar85,0x55);
            auVar159._0_4_ = fVar102 * auVar35._0_4_;
            auVar159._4_4_ = fVar130 * auVar35._4_4_;
            auVar159._8_4_ = fVar131 * auVar35._8_4_;
            auVar159._12_4_ = fVar132 * auVar35._12_4_;
            auVar322 = vfmadd213ps_fma(auVar56,auVar140,auVar159);
            auVar35 = vshufps_avx(auVar85,auVar85,0xaa);
            auVar160._0_4_ = fVar102 * auVar35._0_4_;
            auVar160._4_4_ = fVar130 * auVar35._4_4_;
            auVar160._8_4_ = fVar131 * auVar35._8_4_;
            auVar160._12_4_ = fVar132 * auVar35._12_4_;
            auVar85 = vfmadd213ps_fma(auVar79,auVar140,auVar160);
            fVar335 = auVar86._0_4_;
            auVar161._0_4_ = fVar102 * fVar335;
            auVar161._4_4_ = fVar130 * fVar335;
            auVar161._8_4_ = fVar131 * fVar335;
            auVar161._12_4_ = fVar132 * fVar335;
            auVar89 = vfmadd213ps_fma(auVar217,auVar140,auVar161);
            auVar35 = vshufps_avx(auVar86,auVar86,0x55);
            auVar162._0_4_ = fVar102 * auVar35._0_4_;
            auVar162._4_4_ = fVar130 * auVar35._4_4_;
            auVar162._8_4_ = fVar131 * auVar35._8_4_;
            auVar162._12_4_ = fVar132 * auVar35._12_4_;
            auVar81 = vfmadd213ps_fma(auVar81,auVar140,auVar162);
            auVar35 = vshufps_avx(auVar86,auVar86,0xaa);
            auVar163._0_4_ = fVar102 * auVar35._0_4_;
            auVar163._4_4_ = fVar130 * auVar35._4_4_;
            auVar163._8_4_ = fVar131 * auVar35._8_4_;
            auVar163._12_4_ = fVar132 * auVar35._12_4_;
            auVar82 = vfmadd213ps_fma(auVar82,auVar140,auVar163);
            fVar335 = auVar87._0_4_;
            auVar164._0_4_ = fVar102 * fVar335;
            auVar164._4_4_ = fVar130 * fVar335;
            auVar164._8_4_ = fVar131 * fVar335;
            auVar164._12_4_ = fVar132 * fVar335;
            auVar86 = vfmadd213ps_fma(auVar232,auVar140,auVar164);
            auVar35 = vshufps_avx(auVar87,auVar87,0x55);
            auVar165._0_4_ = fVar102 * auVar35._0_4_;
            auVar165._4_4_ = fVar130 * auVar35._4_4_;
            auVar165._8_4_ = fVar131 * auVar35._8_4_;
            auVar165._12_4_ = fVar132 * auVar35._12_4_;
            auVar83 = vfmadd213ps_fma(auVar83,auVar140,auVar165);
            auVar35 = vshufps_avx(auVar87,auVar87,0xaa);
            auVar166._0_4_ = fVar102 * auVar35._0_4_;
            auVar166._4_4_ = fVar130 * auVar35._4_4_;
            auVar166._8_4_ = fVar131 * auVar35._8_4_;
            auVar166._12_4_ = fVar132 * auVar35._12_4_;
            auVar84 = vfmadd213ps_fma(auVar84,auVar140,auVar166);
            fVar335 = auVar88._0_4_;
            auVar35 = vshufps_avx(auVar88,auVar88,0x55);
            auVar56 = vshufps_avx(auVar88,auVar88,0xaa);
            auVar167._0_4_ = fVar102 * fVar335;
            auVar167._4_4_ = fVar130 * fVar335;
            auVar167._8_4_ = fVar131 * fVar335;
            auVar167._12_4_ = fVar132 * fVar335;
            auVar199._0_4_ = fVar102 * auVar35._0_4_;
            auVar199._4_4_ = fVar130 * auVar35._4_4_;
            auVar199._8_4_ = fVar131 * auVar35._8_4_;
            auVar199._12_4_ = fVar132 * auVar35._12_4_;
            auVar236._0_4_ = fVar102 * auVar56._0_4_;
            auVar236._4_4_ = fVar130 * auVar56._4_4_;
            auVar236._8_4_ = fVar131 * auVar56._8_4_;
            auVar236._12_4_ = fVar132 * auVar56._12_4_;
            auVar87 = vfmadd213ps_fma(_local_368,auVar140,auVar167);
            auVar253 = vfmadd213ps_fma(auVar253,auVar140,auVar199);
            auVar292 = vfmadd213ps_fma(auVar292,auVar140,auVar236);
            fVar102 = auVar114._0_4_;
            fVar188 = auVar34._0_4_;
            auVar121._0_4_ = fVar188 * fVar102;
            fVar131 = auVar114._4_4_;
            fVar208 = auVar34._4_4_;
            auVar121._4_4_ = fVar208 * fVar131;
            fVar335 = auVar114._8_4_;
            fVar210 = auVar34._8_4_;
            auVar121._8_4_ = fVar210 * fVar335;
            fVar343 = auVar114._12_4_;
            fVar212 = auVar34._12_4_;
            auVar121._12_4_ = fVar212 * fVar343;
            fVar130 = auVar80._0_4_;
            fVar187 = auVar33._0_4_;
            auVar200._0_4_ = fVar187 * fVar130;
            fVar132 = auVar80._4_4_;
            fVar207 = auVar33._4_4_;
            auVar200._4_4_ = fVar207 * fVar132;
            fVar342 = auVar80._8_4_;
            fVar209 = auVar33._8_4_;
            auVar200._8_4_ = fVar209 * fVar342;
            fVar344 = auVar80._12_4_;
            fVar211 = auVar33._12_4_;
            auVar200._12_4_ = fVar211 * fVar344;
            auVar33 = vsubps_avx(auVar121,auVar200);
            auVar201._0_4_ = fVar187 * fVar187;
            auVar201._4_4_ = fVar207 * fVar207;
            auVar201._8_4_ = fVar209 * fVar209;
            auVar201._12_4_ = fVar211 * fVar211;
            auVar237._0_4_ = fVar188 * fVar188;
            auVar237._4_4_ = fVar208 * fVar208;
            auVar237._8_4_ = fVar210 * fVar210;
            auVar237._12_4_ = fVar212 * fVar212;
            auVar250._0_4_ = auVar201._0_4_ + auVar237._0_4_;
            auVar250._4_4_ = auVar201._4_4_ + auVar237._4_4_;
            auVar250._8_4_ = auVar201._8_4_ + auVar237._8_4_;
            auVar250._12_4_ = auVar201._12_4_ + auVar237._12_4_;
            auVar34 = vsubps_avx(auVar201,auVar237);
            auVar238._0_4_ = fVar188 * fVar130;
            auVar238._4_4_ = fVar208 * fVar132;
            auVar238._8_4_ = fVar210 * fVar342;
            auVar238._12_4_ = fVar212 * fVar344;
            auVar219._0_4_ = fVar188 * fVar187;
            auVar219._4_4_ = fVar208 * fVar207;
            auVar219._8_4_ = fVar210 * fVar209;
            auVar219._12_4_ = fVar212 * fVar211;
            auVar137._0_4_ = fVar187 * fVar102;
            auVar137._4_4_ = fVar207 * fVar131;
            auVar137._8_4_ = fVar209 * fVar335;
            auVar137._12_4_ = fVar211 * fVar343;
            auVar35 = vsubps_avx(auVar238,auVar137);
            auVar239._0_4_ = fVar102 * fVar130;
            auVar239._4_4_ = fVar131 * fVar132;
            auVar239._8_4_ = fVar335 * fVar342;
            auVar239._12_4_ = fVar343 * fVar344;
            auVar114 = vsubps_avx(auVar239,auVar219);
            auVar72._0_4_ = fVar102 * fVar102;
            auVar72._4_4_ = fVar131 * fVar131;
            auVar72._8_4_ = fVar335 * fVar335;
            auVar72._12_4_ = fVar343 * fVar343;
            auVar56 = vsubps_avx(auVar250,auVar72);
            auVar251._0_4_ = auVar72._0_4_ + auVar34._0_4_;
            auVar251._4_4_ = auVar72._4_4_ + auVar34._4_4_;
            auVar251._8_4_ = auVar72._8_4_ + auVar34._8_4_;
            auVar251._12_4_ = auVar72._12_4_ + auVar34._12_4_;
            auVar34 = vsubps_avx(auVar34,auVar72);
            auVar42._0_4_ = fVar130 * fVar130;
            auVar42._4_4_ = fVar132 * fVar132;
            auVar42._8_4_ = fVar342 * fVar342;
            auVar42._12_4_ = fVar344 * fVar344;
            auVar56 = vsubps_avx(auVar56,auVar42);
            auVar79 = vsubps_avx(auVar251,auVar42);
            auVar43._0_4_ = auVar42._0_4_ + auVar34._0_4_;
            auVar43._4_4_ = auVar42._4_4_ + auVar34._4_4_;
            auVar43._8_4_ = auVar42._8_4_ + auVar34._8_4_;
            auVar43._12_4_ = auVar42._12_4_ + auVar34._12_4_;
            auVar319._0_4_ = auVar121._0_4_ + auVar200._0_4_ + auVar121._0_4_ + auVar200._0_4_;
            auVar319._4_4_ = auVar121._4_4_ + auVar200._4_4_ + auVar121._4_4_ + auVar200._4_4_;
            auVar319._8_4_ = auVar121._8_4_ + auVar200._8_4_ + auVar121._8_4_ + auVar200._8_4_;
            auVar319._12_4_ = auVar121._12_4_ + auVar200._12_4_ + auVar121._12_4_ + auVar200._12_4_;
            auVar73._0_4_ = auVar35._0_4_ + auVar35._0_4_;
            auVar73._4_4_ = auVar35._4_4_ + auVar35._4_4_;
            auVar73._8_4_ = auVar35._8_4_ + auVar35._8_4_;
            auVar73._12_4_ = auVar35._12_4_ + auVar35._12_4_;
            auVar91 = ZEXT416(0) << 0x20;
            auVar240._0_4_ = auVar73._0_4_ * 0.0;
            auVar240._4_4_ = auVar73._4_4_ * 0.0;
            auVar240._8_4_ = auVar73._8_4_ * 0.0;
            auVar240._12_4_ = auVar73._12_4_ * 0.0;
            auVar34 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar319,auVar240);
            auVar289._0_4_ = auVar319._0_4_ + auVar240._0_4_;
            auVar289._4_4_ = auVar319._4_4_ + auVar240._4_4_;
            auVar289._8_4_ = auVar319._8_4_ + auVar240._8_4_;
            auVar289._12_4_ = auVar319._12_4_ + auVar240._12_4_;
            auVar35 = vfmadd213ps_fma(auVar319,auVar91,auVar73);
            auVar74._0_4_ = auVar239._0_4_ + auVar219._0_4_ + auVar239._0_4_ + auVar219._0_4_;
            auVar74._4_4_ = auVar239._4_4_ + auVar219._4_4_ + auVar239._4_4_ + auVar219._4_4_;
            auVar74._8_4_ = auVar239._8_4_ + auVar219._8_4_ + auVar239._8_4_ + auVar219._8_4_;
            auVar74._12_4_ = auVar239._12_4_ + auVar219._12_4_ + auVar239._12_4_ + auVar219._12_4_;
            auVar241._0_4_ = auVar74._0_4_ * 0.0;
            auVar241._4_4_ = auVar74._4_4_ * 0.0;
            auVar241._8_4_ = auVar74._8_4_ * 0.0;
            auVar241._12_4_ = auVar74._12_4_ * 0.0;
            auVar80 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar79,auVar241);
            auVar264._0_4_ = auVar79._0_4_ + auVar241._0_4_;
            auVar264._4_4_ = auVar79._4_4_ + auVar241._4_4_;
            auVar264._8_4_ = auVar79._8_4_ + auVar241._8_4_;
            auVar264._12_4_ = auVar79._12_4_ + auVar241._12_4_;
            auVar79 = vfmadd213ps_fma(auVar79,auVar91,auVar74);
            auVar75._0_4_ = auVar33._0_4_ + auVar33._0_4_;
            auVar75._4_4_ = auVar33._4_4_ + auVar33._4_4_;
            auVar75._8_4_ = auVar33._8_4_ + auVar33._8_4_;
            auVar75._12_4_ = auVar33._12_4_ + auVar33._12_4_;
            auVar274._0_4_ = auVar80._0_4_ + auVar75._0_4_;
            auVar274._4_4_ = auVar80._4_4_ + auVar75._4_4_;
            auVar274._8_4_ = auVar80._8_4_ + auVar75._8_4_;
            auVar274._12_4_ = auVar80._12_4_ + auVar75._12_4_;
            auVar80 = vfmadd231ps_fma(auVar264,auVar75,auVar91);
            auVar88 = vfmadd231ps_fma(auVar79,auVar91,auVar75);
            auVar122._0_4_ = auVar114._0_4_ + auVar114._0_4_;
            auVar122._4_4_ = auVar114._4_4_ + auVar114._4_4_;
            auVar122._8_4_ = auVar114._8_4_ + auVar114._8_4_;
            auVar122._12_4_ = auVar114._12_4_ + auVar114._12_4_;
            auVar76._0_4_ = auVar43._0_4_ * 0.0;
            auVar76._4_4_ = auVar43._4_4_ * 0.0;
            auVar76._8_4_ = auVar43._8_4_ * 0.0;
            auVar76._12_4_ = auVar43._12_4_ * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar122,auVar76);
            auVar77._0_4_ = auVar122._0_4_ + auVar76._0_4_;
            auVar77._4_4_ = auVar122._4_4_ + auVar76._4_4_;
            auVar77._8_4_ = auVar122._8_4_ + auVar76._8_4_;
            auVar77._12_4_ = auVar122._12_4_ + auVar76._12_4_;
            auVar114 = vfmadd213ps_fma(auVar122,auVar91,auVar43);
            auVar44._0_4_ = auVar238._0_4_ + auVar137._0_4_ + auVar238._0_4_ + auVar137._0_4_;
            auVar44._4_4_ = auVar238._4_4_ + auVar137._4_4_ + auVar238._4_4_ + auVar137._4_4_;
            auVar44._8_4_ = auVar238._8_4_ + auVar137._8_4_ + auVar238._8_4_ + auVar137._8_4_;
            auVar44._12_4_ = auVar238._12_4_ + auVar137._12_4_ + auVar238._12_4_ + auVar137._12_4_;
            fVar187 = auVar44._0_4_ + auVar33._0_4_;
            fVar207 = auVar44._4_4_ + auVar33._4_4_;
            fVar209 = auVar44._8_4_ + auVar33._8_4_;
            fVar211 = auVar44._12_4_ + auVar33._12_4_;
            auVar79 = vfmadd231ps_fma(auVar77,auVar44,auVar91);
            auVar114 = vfmadd231ps_fma(auVar114,auVar91,auVar44);
            auVar140 = vfmadd231ps_fma(auVar289,auVar56,auVar91);
            auVar90 = vfmadd231ps_fma(auVar35,auVar91,auVar56);
            local_308._0_4_ = auVar322._0_4_;
            local_308._4_4_ = auVar322._4_4_;
            uStack_300._0_4_ = auVar322._8_4_;
            uStack_300._4_4_ = auVar322._12_4_;
            local_358._0_4_ = auVar85._0_4_;
            local_358._4_4_ = auVar85._4_4_;
            uStack_350._0_4_ = auVar85._8_4_;
            uStack_350._4_4_ = auVar85._12_4_;
            auVar290._0_4_ = fVar187 * 0.0;
            auVar290._4_4_ = fVar207 * 0.0;
            auVar290._8_4_ = fVar209 * 0.0;
            auVar290._12_4_ = fVar211 * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar274,auVar290);
            fVar335 = auVar79._0_4_;
            auVar252._0_4_ = fVar335 * 0.0;
            fVar342 = auVar79._4_4_;
            auVar252._4_4_ = fVar342 * 0.0;
            fVar343 = auVar79._8_4_;
            auVar252._8_4_ = fVar343 * 0.0;
            fVar344 = auVar79._12_4_;
            auVar252._12_4_ = fVar344 * 0.0;
            auVar35 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar80,auVar252);
            fVar102 = auVar114._0_4_;
            auVar45._0_4_ = fVar102 * 0.0;
            fVar130 = auVar114._4_4_;
            auVar45._4_4_ = fVar130 * 0.0;
            fVar131 = auVar114._8_4_;
            auVar45._8_4_ = fVar131 * 0.0;
            fVar132 = auVar114._12_4_;
            auVar45._12_4_ = fVar132 * 0.0;
            auVar114 = vfmadd213ps_fma(auVar91,auVar88,auVar45);
            auVar85 = vfmadd231ps_fma(auVar290,auVar81,auVar274);
            auVar322 = vfmadd231ps_fma(auVar252,auVar81,auVar80);
            auVar79 = vfmadd213ps_fma(auVar81,auVar88,auVar45);
            local_2c8._0_4_ = auVar84._0_4_;
            local_2c8._4_4_ = auVar84._4_4_;
            uStack_2c0._0_4_ = auVar84._8_4_;
            uStack_2c0._4_4_ = auVar84._12_4_;
            auVar138._0_4_ = fVar187 * (float)local_2c8._0_4_;
            auVar138._4_4_ = fVar207 * (float)local_2c8._4_4_;
            auVar138._8_4_ = fVar209 * (float)uStack_2c0;
            auVar138._12_4_ = fVar211 * uStack_2c0._4_4_;
            auVar78._0_4_ = (float)local_2c8._0_4_ * fVar335;
            auVar78._4_4_ = (float)local_2c8._4_4_ * fVar342;
            auVar78._8_4_ = (float)uStack_2c0 * fVar343;
            auVar78._12_4_ = uStack_2c0._4_4_ * fVar344;
            auVar46._0_4_ = (float)local_2c8._0_4_ * fVar102;
            auVar46._4_4_ = (float)local_2c8._4_4_ * fVar130;
            auVar46._8_4_ = (float)uStack_2c0 * fVar131;
            auVar46._12_4_ = uStack_2c0._4_4_ * fVar132;
            auVar81 = vfmadd231ps_fma(auVar138,auVar83,auVar274);
            auVar84 = vfmadd231ps_fma(auVar78,auVar83,auVar80);
            auVar83 = vfmadd231ps_fma(auVar46,auVar88,auVar83);
            local_318._0_4_ = auVar292._0_4_;
            local_318._4_4_ = auVar292._4_4_;
            uStack_310._0_4_ = auVar292._8_4_;
            uStack_310._4_4_ = auVar292._12_4_;
            auVar347._0_4_ = fVar187 * (float)local_318._0_4_;
            auVar347._4_4_ = fVar207 * (float)local_318._4_4_;
            auVar347._8_4_ = fVar209 * (float)uStack_310;
            auVar347._12_4_ = fVar211 * uStack_310._4_4_;
            auVar275._0_4_ = (float)local_318._0_4_ * fVar335;
            auVar275._4_4_ = (float)local_318._4_4_ * fVar342;
            auVar275._8_4_ = (float)uStack_310 * fVar343;
            auVar275._12_4_ = uStack_310._4_4_ * fVar344;
            auVar123._0_4_ = (float)local_318._0_4_ * fVar102;
            auVar123._4_4_ = (float)local_318._4_4_ * fVar130;
            auVar123._8_4_ = (float)uStack_310 * fVar131;
            auVar123._12_4_ = uStack_310._4_4_ * fVar132;
            auVar292 = vfmadd231ps_fma(auVar347,auVar253,auVar274);
            auVar80 = vfmadd231ps_fma(auVar275,auVar253,auVar80);
            auVar253 = vfmadd231ps_fma(auVar123,auVar253,auVar88);
            local_2f8._0_4_ = auVar56._0_4_;
            local_2f8._4_4_ = auVar56._4_4_;
            fStack_2f0 = auVar56._8_4_;
            fStack_2ec = auVar56._12_4_;
            local_338._0_4_ = auVar34._0_4_;
            local_338._4_4_ = auVar34._4_4_;
            uStack_330._0_4_ = auVar34._8_4_;
            uStack_330._4_4_ = auVar34._12_4_;
            auVar202._0_4_ = (float)local_2f8._0_4_ + (float)local_338._0_4_;
            auVar202._4_4_ = (float)local_2f8._4_4_ + (float)local_338._4_4_;
            auVar202._8_4_ = fStack_2f0 + (float)uStack_330;
            auVar202._12_4_ = fStack_2ec + uStack_330._4_4_;
            auVar33 = vfmadd231ps_fma(auVar33,auVar141,auVar202);
            auVar34 = vfmadd231ps_fma(auVar35,auVar141,auVar140);
            auVar35 = vfmadd231ps_fma(auVar114,auVar90,auVar141);
            auVar114 = vfmadd231ps_fma(auVar85,auVar89,auVar202);
            auVar56 = vfmadd231ps_fma(auVar322,auVar89,auVar140);
            auVar79 = vfmadd231ps_fma(auVar79,auVar90,auVar89);
            auVar81 = vfmadd231ps_fma(auVar81,auVar86,auVar202);
            auVar84 = vfmadd231ps_fma(auVar84,auVar86,auVar140);
            auVar83 = vfmadd231ps_fma(auVar83,auVar90,auVar86);
            auVar292 = vfmadd231ps_fma(auVar292,auVar87,auVar202);
            local_378._4_4_ = auVar292._4_4_ + (float)local_308._4_4_ + 0.0;
            local_378._0_4_ = auVar292._0_4_ + (float)local_308._0_4_ + 0.0;
            fStack_370 = auVar292._8_4_ + (float)uStack_300 + 0.0;
            fStack_36c = auVar292._12_4_ + uStack_300._4_4_ + 0.0;
            auVar80 = vfmadd231ps_fma(auVar80,auVar87,auVar140);
            local_388._4_4_ = auVar80._4_4_ + (float)local_358._4_4_ + 0.0;
            local_388._0_4_ = auVar80._0_4_ + (float)local_358._0_4_ + 0.0;
            fStack_380 = auVar80._8_4_ + (float)uStack_350 + 0.0;
            fStack_37c = auVar80._12_4_ + uStack_350._4_4_ + 0.0;
            auVar80 = vfmadd231ps_fma(auVar253,auVar87,auVar90);
            fVar102 = auVar80._0_4_ + auVar82._0_4_ + 0.0;
            fVar130 = auVar80._4_4_ + auVar82._4_4_ + 0.0;
            fVar131 = auVar80._8_4_ + auVar82._8_4_ + 0.0;
            fVar132 = auVar80._12_4_ + auVar82._12_4_ + 0.0;
            auVar124._0_4_ = auVar79._0_4_ * auVar84._0_4_;
            auVar124._4_4_ = auVar79._4_4_ * auVar84._4_4_;
            auVar124._8_4_ = auVar79._8_4_ * auVar84._8_4_;
            auVar124._12_4_ = auVar79._12_4_ * auVar84._12_4_;
            auVar80 = vfmsub231ps_fma(auVar124,auVar56,auVar83);
            auVar320._0_4_ = auVar114._0_4_ * auVar83._0_4_;
            auVar320._4_4_ = auVar114._4_4_ * auVar83._4_4_;
            auVar320._8_4_ = auVar114._8_4_ * auVar83._8_4_;
            auVar320._12_4_ = auVar114._12_4_ * auVar83._12_4_;
            auVar82 = vfmsub231ps_fma(auVar320,auVar79,auVar81);
            auVar276._0_4_ = auVar56._0_4_ * auVar81._0_4_;
            auVar276._4_4_ = auVar56._4_4_ * auVar81._4_4_;
            auVar276._8_4_ = auVar56._8_4_ * auVar81._8_4_;
            auVar276._12_4_ = auVar56._12_4_ * auVar81._12_4_;
            auVar253 = vfmsub231ps_fma(auVar276,auVar114,auVar84);
            fVar335 = auVar35._0_4_;
            auVar348._0_4_ = fVar335 * auVar81._0_4_;
            fVar342 = auVar35._4_4_;
            auVar348._4_4_ = fVar342 * auVar81._4_4_;
            fVar343 = auVar35._8_4_;
            auVar348._8_4_ = fVar343 * auVar81._8_4_;
            fVar344 = auVar35._12_4_;
            auVar348._12_4_ = fVar344 * auVar81._12_4_;
            auVar292 = vfmsub231ps_fma(auVar348,auVar33,auVar83);
            auVar203._0_4_ = auVar34._0_4_ * auVar83._0_4_;
            auVar203._4_4_ = auVar34._4_4_ * auVar83._4_4_;
            auVar203._8_4_ = auVar34._8_4_ * auVar83._8_4_;
            auVar203._12_4_ = auVar34._12_4_ * auVar83._12_4_;
            auVar83 = vfmsub231ps_fma(auVar203,auVar84,auVar35);
            auVar265._0_4_ = auVar33._0_4_ * auVar84._0_4_;
            auVar265._4_4_ = auVar33._4_4_ * auVar84._4_4_;
            auVar265._8_4_ = auVar33._8_4_ * auVar84._8_4_;
            auVar265._12_4_ = auVar33._12_4_ * auVar84._12_4_;
            auVar81 = vfmsub231ps_fma(auVar265,auVar34,auVar81);
            auVar139._0_4_ = auVar56._0_4_ * fVar335;
            auVar139._4_4_ = auVar56._4_4_ * fVar342;
            auVar139._8_4_ = auVar56._8_4_ * fVar343;
            auVar139._12_4_ = auVar56._12_4_ * fVar344;
            auVar84 = vfmsub231ps_fma(auVar139,auVar34,auVar79);
            auVar220._0_4_ = auVar79._0_4_ * auVar33._0_4_;
            auVar220._4_4_ = auVar79._4_4_ * auVar33._4_4_;
            auVar220._8_4_ = auVar79._8_4_ * auVar33._8_4_;
            auVar220._12_4_ = auVar79._12_4_ * auVar33._12_4_;
            auVar79 = vfmsub231ps_fma(auVar220,auVar35,auVar114);
            auVar291._0_4_ = auVar114._0_4_ * auVar34._0_4_;
            auVar291._4_4_ = auVar114._4_4_ * auVar34._4_4_;
            auVar291._8_4_ = auVar114._8_4_ * auVar34._8_4_;
            auVar291._12_4_ = auVar114._12_4_ * auVar34._12_4_;
            auVar85 = vfmsub231ps_fma(auVar291,auVar33,auVar56);
            auVar329._0_4_ = auVar253._0_4_ * fVar335;
            auVar329._4_4_ = auVar253._4_4_ * fVar342;
            auVar329._8_4_ = auVar253._8_4_ * fVar343;
            auVar329._12_4_ = auVar253._12_4_ * fVar344;
            auVar34 = vfmadd231ps_fma(auVar329,auVar82,auVar34);
            auVar56 = vfmadd231ps_fma(auVar34,auVar80,auVar33);
            auVar33 = vdivps_avx(auVar80,auVar56);
            auVar34 = vdivps_avx(auVar83,auVar56);
            auVar35 = vdivps_avx(auVar84,auVar56);
            _local_318 = vdivps_avx(auVar82,auVar56);
            auVar114 = vdivps_avx(auVar292,auVar56);
            _local_398 = vdivps_avx(auVar79,auVar56);
            local_328 = vdivps_avx(auVar253,auVar56);
            local_2e8 = vdivps_avx(auVar81,auVar56);
            local_2d8 = vdivps_avx(auVar85,auVar56);
            auVar266._0_4_ = fVar102 * local_328._0_4_;
            auVar266._4_4_ = fVar130 * local_328._4_4_;
            auVar266._8_4_ = fVar131 * local_328._8_4_;
            auVar266._12_4_ = fVar132 * local_328._12_4_;
            auVar277._0_4_ = fVar102 * local_2e8._0_4_;
            auVar277._4_4_ = fVar130 * local_2e8._4_4_;
            auVar277._8_4_ = fVar131 * local_2e8._8_4_;
            auVar277._12_4_ = fVar132 * local_2e8._12_4_;
            auVar321._0_4_ = fVar102 * local_2d8._0_4_;
            auVar321._4_4_ = fVar130 * local_2d8._4_4_;
            auVar321._8_4_ = fVar131 * local_2d8._8_4_;
            auVar321._12_4_ = fVar132 * local_2d8._12_4_;
            auVar56 = vfmadd231ps_fma(auVar266,_local_388,_local_318);
            auVar79 = vfmadd231ps_fma(auVar277,_local_388,auVar114);
            auVar80 = vfmadd231ps_fma(auVar321,_local_398,_local_388);
          }
          else {
            auVar33 = auVar35;
            _local_398 = local_38;
            do {
              uVar3 = 0;
              for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar3 = uVar3 + 1;
              }
              iVar4 = *(int *)(local_108 + (ulong)uVar3 * 4);
              auVar79._4_4_ = iVar4;
              auVar79._0_4_ = iVar4;
              auVar79._8_4_ = iVar4;
              auVar79._12_4_ = iVar4;
              auVar34 = vpcmpeqd_avx(auVar79,local_108);
              auVar34 = vpand_avx(auVar34,_local_398);
              plVar2 = (long *)(*(long *)&pGVar19[1].fnumTimeSegments + (long)iVar4 * 0x38);
              iVar4 = *(int *)(*(long *)&pGVar19[1].fnumTimeSegments + 0x20 + (long)iVar4 * 0x38);
              if (iVar4 == 0x9134) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
                local_138 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
                auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
                in_ZMM10 = ZEXT1664(auVar114);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
                auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
                auVar334 = ZEXT1664(auVar114);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
                auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
                in_ZMM11 = ZEXT1664(auVar114);
              }
              else if (iVar4 == 0x9234) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar80,0x4c);
                local_138 = vshufps_avx(auVar114,auVar114,0x78);
                auVar81._8_8_ = 0;
                auVar81._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar81,0x4c);
                auVar114 = vshufps_avx(auVar114,auVar114,0x78);
                in_ZMM10 = ZEXT1664(auVar114);
                auVar82._8_8_ = 0;
                auVar82._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar82,0x4c);
                auVar114 = vshufps_avx(auVar114,auVar114,0x78);
                auVar334 = ZEXT1664(auVar114);
                auVar83._8_8_ = 0;
                auVar83._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar83,0x4c);
                auVar114 = vshufps_avx(auVar114,auVar114,0x78);
                in_ZMM11 = ZEXT1664(auVar114);
              }
              else if (iVar4 == 0xb001) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar84._8_8_ = 0;
                auVar84._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar114 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
                auVar253._8_8_ = 0;
                auVar253._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
                auVar56 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar253);
                auVar79 = vshufps_avx(auVar56,auVar253,0xd8);
                auVar292._8_8_ = 0;
                auVar292._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar56 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar292);
                auVar80 = vshufps_avx(auVar56,auVar292,0xd8);
                fVar335 = *(float *)(lVar6 + 0x24 + lVar22);
                fVar342 = *(float *)(lVar6 + 0x28 + lVar22);
                fVar343 = *(float *)(lVar6 + 0x2c + lVar22);
                fVar344 = *(float *)(lVar6 + 0x30 + lVar22);
                auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar342 * fVar342)),ZEXT416((uint)fVar335),
                                          ZEXT416((uint)fVar335));
                auVar56 = vfmadd231ss_fma(auVar56,ZEXT416((uint)fVar343),ZEXT416((uint)fVar343));
                auVar81 = vfmadd231ss_fma(auVar56,ZEXT416((uint)fVar344),ZEXT416((uint)fVar344));
                auVar56 = vrsqrtss_avx(auVar81,auVar81);
                fVar187 = auVar56._0_4_;
                fVar187 = fVar187 * 1.5 + auVar81._0_4_ * -0.5 * fVar187 * fVar187 * fVar187;
                auVar56 = vinsertps_avx(auVar80,ZEXT416((uint)(fVar335 * fVar187)),0x30);
                in_ZMM11 = ZEXT1664(auVar56);
                local_138 = vinsertps_avx(auVar79,ZEXT416((uint)(fVar342 * fVar187)),0x30);
                auVar56 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
                auVar114 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar344 * fVar187)),0x30);
                auVar334 = ZEXT1664(auVar114);
                auVar114 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
                auVar114 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar343 * fVar187)),0x30);
                in_ZMM10 = ZEXT1664(auVar114);
              }
              else if (iVar4 == 0x9244) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                local_138 = *(undefined1 (*) [16])(lVar6 + lVar22);
                in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar22));
                auVar334 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar22));
                in_ZMM11 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar22));
              }
              _local_398 = auVar34 ^ _local_398;
              local_258._4_4_ = local_138._0_4_;
              local_258._0_4_ = local_258._4_4_;
              local_258._8_4_ = local_258._4_4_;
              local_258._12_4_ = local_258._4_4_;
              auVar114 = vshufps_avx(local_138,local_138,0x55);
              local_78 = vshufps_avx(local_138,local_138,0xaa);
              auVar56 = vshufps_avx(local_138,local_138,0xff);
              local_88._4_4_ = in_ZMM10._0_4_;
              local_88._0_4_ = local_88._4_4_;
              local_88._8_4_ = local_88._4_4_;
              local_88._12_4_ = local_88._4_4_;
              auVar79 = in_ZMM10._0_16_;
              local_98 = vshufps_avx(auVar79,auVar79,0x55);
              local_a8 = vshufps_avx(auVar79,auVar79,0xaa);
              local_b8 = vshufps_avx(auVar79,auVar79,0xff);
              local_c8._4_4_ = auVar334._0_4_;
              local_c8._0_4_ = local_c8._4_4_;
              local_c8._8_4_ = local_c8._4_4_;
              local_c8._12_4_ = local_c8._4_4_;
              auVar80 = auVar334._0_16_;
              local_d8 = vshufps_avx(auVar80,auVar80,0x55);
              auVar79 = vshufps_avx(auVar80,auVar80,0xaa);
              auVar80 = vshufps_avx(auVar80,auVar80,0xff);
              local_188._4_4_ = in_ZMM11._0_4_;
              local_188._0_4_ = local_188._4_4_;
              local_188._8_4_ = local_188._4_4_;
              local_188._12_4_ = local_188._4_4_;
              auVar81 = in_ZMM11._0_16_;
              local_e8 = vshufps_avx(auVar81,auVar81,0x55);
              local_48 = vshufps_avx(auVar81,auVar81,0xaa);
              local_58 = vshufps_avx(auVar81,auVar81,0xff);
              iVar4 = (int)plVar2[0xb];
              if (iVar4 == 0x9134) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
                local_128 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
                local_238 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
                auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
                in_ZMM12 = ZEXT1664(auVar81);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
                auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
                in_ZMM6 = ZEXT1664(auVar81);
              }
              else if (iVar4 == 0x9234) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar85._8_8_ = 0;
                auVar85._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar85,0x4c);
                local_128 = vshufps_avx(auVar81,auVar81,0x78);
                auVar86._8_8_ = 0;
                auVar86._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar86,0x4c);
                local_238 = vshufps_avx(auVar81,auVar81,0x78);
                auVar87._8_8_ = 0;
                auVar87._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar87,0x4c);
                auVar81 = vshufps_avx(auVar81,auVar81,0x78);
                in_ZMM12 = ZEXT1664(auVar81);
                auVar88._8_8_ = 0;
                auVar88._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar88,0x4c);
                auVar81 = vshufps_avx(auVar81,auVar81,0x78);
                in_ZMM6 = ZEXT1664(auVar81);
              }
              else if (iVar4 == 0xb001) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar140._8_8_ = 0;
                auVar140._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar81 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
                auVar141._8_8_ = 0;
                auVar141._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
                local_68 = ZEXT416(*(uint *)(lVar6 + 0xc + lVar22));
                auVar82 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar141);
                auVar83 = vshufps_avx(auVar82,auVar141,0xd8);
                auVar322._8_8_ = 0;
                auVar322._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar82 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar322);
                auVar84 = vshufps_avx(auVar82,auVar322,0xd8);
                fVar335 = *(float *)(lVar6 + 0x24 + lVar22);
                fVar342 = *(float *)(lVar6 + 0x28 + lVar22);
                fVar343 = *(float *)(lVar6 + 0x2c + lVar22);
                fVar344 = *(float *)(lVar6 + 0x30 + lVar22);
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar342 * fVar342)),ZEXT416((uint)fVar335),
                                          ZEXT416((uint)fVar335));
                auVar82 = vfmadd231ss_fma(auVar82,ZEXT416((uint)fVar343),ZEXT416((uint)fVar343));
                auVar253 = vfmadd231ss_fma(auVar82,ZEXT416((uint)fVar344),ZEXT416((uint)fVar344));
                auVar82 = vrsqrtss_avx(auVar253,auVar253);
                fVar187 = auVar82._0_4_;
                fVar187 = fVar187 * fVar187 * fVar187 * auVar253._0_4_ * -0.5 + fVar187 * 1.5;
                auVar82 = vinsertps_avx(auVar84,ZEXT416((uint)(fVar335 * fVar187)),0x30);
                in_ZMM6 = ZEXT1664(auVar82);
                local_128 = vinsertps_avx(auVar83,ZEXT416((uint)(fVar342 * fVar187)),0x30);
                auVar82 = vinsertps_avx(local_68,ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
                auVar81 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar344 * fVar187)),0x30);
                in_ZMM12 = ZEXT1664(auVar81);
                auVar81 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
                local_238 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar343 * fVar187)),0x30);
              }
              else if (iVar4 == 0x9244) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                local_128 = *(undefined1 (*) [16])(lVar6 + lVar22);
                local_238 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                in_ZMM12 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar22));
                in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar22));
              }
              local_328 = vblendvps_avx(local_328,local_258,auVar34);
              _local_348 = vblendvps_avx(_local_348,auVar114,auVar34);
              _local_338 = vblendvps_avx(_local_338,local_78,auVar34);
              local_248 = vblendvps_avx(local_248,auVar56,auVar34);
              local_2e8 = vblendvps_avx(local_2e8,local_88,auVar34);
              _local_368 = vblendvps_avx(_local_368,local_98,auVar34);
              _local_358 = vblendvps_avx(_local_358,local_a8,auVar34);
              _local_2a8 = vblendvps_avx(_local_2a8,local_b8,auVar34);
              _local_388 = vblendvps_avx(_local_388,local_c8,auVar34);
              _local_2c8 = vblendvps_avx(_local_2c8,local_d8,auVar34);
              _local_308 = vblendvps_avx(_local_308,auVar79,auVar34);
              _local_2f8 = vblendvps_avx(_local_2f8,auVar80,auVar34);
              _local_378 = vblendvps_avx(_local_378,local_188,auVar34);
              local_2d8 = vblendvps_avx(local_2d8,local_e8,auVar34);
              _local_318 = vblendvps_avx(_local_318,local_48,auVar34);
              _local_2b8 = vblendvps_avx(_local_2b8,local_58,auVar34);
              uVar23 = local_128._0_4_;
              auVar89._4_4_ = uVar23;
              auVar89._0_4_ = uVar23;
              auVar89._8_4_ = uVar23;
              auVar89._12_4_ = uVar23;
              _local_208 = vblendvps_avx(_local_208,auVar89,auVar34);
              auVar114 = vshufps_avx(local_128,local_128,0x55);
              _local_1f8 = vblendvps_avx(_local_1f8,auVar114,auVar34);
              auVar114 = vshufps_avx(local_128,local_128,0xaa);
              _local_1e8 = vblendvps_avx(_local_1e8,auVar114,auVar34);
              auVar114 = vshufps_avx(local_128,local_128,0xff);
              auVar114 = vblendvps_avx(in_ZMM5._0_16_,auVar114,auVar34);
              in_ZMM5 = ZEXT1664(auVar114);
              uVar23 = local_238._0_4_;
              auVar90._4_4_ = uVar23;
              auVar90._0_4_ = uVar23;
              auVar90._8_4_ = uVar23;
              auVar90._12_4_ = uVar23;
              _local_288 = vblendvps_avx(_local_288,auVar90,auVar34);
              auVar56 = vshufps_avx(local_238,local_238,0x55);
              _local_118 = vblendvps_avx(_local_118,auVar56,auVar34);
              auVar56 = vshufps_avx(local_238,local_238,0xaa);
              _local_1d8 = vblendvps_avx(_local_1d8,auVar56,auVar34);
              auVar56 = vshufps_avx(local_238,local_238,0xff);
              auVar33 = vblendvps_avx(auVar33,auVar56,auVar34);
              uVar23 = in_ZMM12._0_4_;
              auVar91._4_4_ = uVar23;
              auVar91._0_4_ = uVar23;
              auVar91._8_4_ = uVar23;
              auVar91._12_4_ = uVar23;
              _local_278 = vblendvps_avx(_local_278,auVar91,auVar34);
              auVar79 = in_ZMM12._0_16_;
              auVar56 = vshufps_avx(auVar79,auVar79,0x55);
              _local_1c8 = vblendvps_avx(_local_1c8,auVar56,auVar34);
              auVar56 = vshufps_avx(auVar79,auVar79,0xaa);
              _local_1b8 = vblendvps_avx(_local_1b8,auVar56,auVar34);
              auVar56 = vshufps_avx(auVar79,auVar79,0xff);
              local_218 = vblendvps_avx(local_218,auVar56,auVar34);
              uVar23 = in_ZMM6._0_4_;
              auVar92._4_4_ = uVar23;
              auVar92._0_4_ = uVar23;
              auVar92._8_4_ = uVar23;
              auVar92._12_4_ = uVar23;
              _local_268 = vblendvps_avx(_local_268,auVar92,auVar34);
              auVar79 = in_ZMM6._0_16_;
              auVar56 = vshufps_avx(auVar79,auVar79,0x55);
              _local_1a8 = vblendvps_avx(_local_1a8,auVar56,auVar34);
              auVar56 = vshufps_avx(auVar79,auVar79,0xaa);
              _local_198 = vblendvps_avx(_local_198,auVar56,auVar34);
              auVar56 = vshufps_avx(auVar79,auVar79,0xff);
              local_228 = vblendvps_avx(local_228,auVar56,auVar34);
              uVar20 = vmovmskps_avx(_local_398);
            } while (uVar20 != 0);
            auVar93._0_4_ =
                 local_218._0_4_ * (float)local_2f8._0_4_ +
                 auVar33._0_4_ * (float)local_2a8._0_4_ +
                 local_248._0_4_ * auVar114._0_4_ + local_228._0_4_ * local_2b8._0_4_;
            auVar93._4_4_ =
                 local_218._4_4_ * (float)local_2f8._4_4_ +
                 auVar33._4_4_ * (float)local_2a8._4_4_ +
                 local_248._4_4_ * auVar114._4_4_ + local_228._4_4_ * local_2b8._4_4_;
            auVar93._8_4_ =
                 local_218._8_4_ * fStack_2f0 +
                 auVar33._8_4_ * fStack_2a0 +
                 local_248._8_4_ * auVar114._8_4_ + local_228._8_4_ * local_2b8._8_4_;
            auVar93._12_4_ =
                 local_218._12_4_ * fStack_2ec +
                 auVar33._12_4_ * fStack_29c +
                 local_248._12_4_ * auVar114._12_4_ + local_228._12_4_ * local_2b8._12_4_;
            uVar18 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
            auVar47._0_8_ = uVar18 ^ 0x8000000080000000;
            auVar47._8_4_ = -auVar93._8_4_;
            auVar47._12_4_ = -auVar93._12_4_;
            auVar79 = vcmpps_avx(auVar93,auVar47,1);
            auVar168._0_8_ = local_228._0_8_ ^ 0x8000000080000000;
            auVar168._8_4_ = -local_228._8_4_;
            auVar168._12_4_ = -local_228._12_4_;
            auVar34 = vblendvps_avx(local_228,auVar168,auVar79);
            auVar169._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
            auVar169._8_4_ = -auVar114._8_4_;
            auVar169._12_4_ = -auVar114._12_4_;
            auVar114 = vblendvps_avx(auVar114,auVar169,auVar79);
            auVar170._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
            auVar170._8_4_ = -auVar33._8_4_;
            auVar170._12_4_ = -auVar33._12_4_;
            auVar56 = vblendvps_avx(auVar33,auVar170,auVar79);
            auVar125._0_8_ = local_218._0_8_ ^ 0x8000000080000000;
            auVar125._8_4_ = -local_218._8_4_;
            auVar125._12_4_ = -local_218._12_4_;
            auVar79 = vblendvps_avx(local_218,auVar125,auVar79);
            auVar83 = vmaxps_avx(auVar47,auVar93);
            auVar142._8_4_ = 0x7fffffff;
            auVar142._0_8_ = 0x7fffffff7fffffff;
            auVar142._12_4_ = 0x7fffffff;
            auVar33 = vandps_avx(auVar93,auVar142);
            fVar335 = auVar33._0_4_;
            fVar342 = auVar33._4_4_;
            fVar343 = auVar33._8_4_;
            fVar344 = auVar33._12_4_;
            auVar143._8_4_ = 0x3f800000;
            auVar143._0_8_ = 0x3f8000003f800000;
            auVar143._12_4_ = 0x3f800000;
            auVar80 = vsubps_avx(auVar143,auVar33);
            auVar80 = vsqrtps_avx(auVar80);
            auVar171._0_4_ =
                 auVar80._0_4_ *
                 (fVar335 * (fVar335 * (fVar335 * (fVar335 * (fVar335 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar171._4_4_ =
                 auVar80._4_4_ *
                 (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar171._8_4_ =
                 auVar80._8_4_ *
                 (fVar343 * (fVar343 * (fVar343 * (fVar343 * (fVar343 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar171._12_4_ =
                 auVar80._12_4_ *
                 (fVar344 * (fVar344 * (fVar344 * (fVar344 * (fVar344 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar278._8_4_ = 0x3fc90fdb;
            auVar278._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar278._12_4_ = 0x3fc90fdb;
            auVar80 = vsubps_avx(auVar278,auVar171);
            auVar84 = ZEXT816(0) << 0x20;
            auVar81 = vmaxps_avx(auVar84,auVar80);
            auVar80 = vcmpps_avx(auVar83,auVar84,1);
            auVar323._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar323._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar323._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar80 = vblendvps_avx(auVar81,auVar323,auVar80);
            auVar33 = vcmpps_avx(auVar33,auVar143,6);
            auVar80 = vsubps_avx(auVar278,auVar80);
            auVar293._8_4_ = 0x7fc00000;
            auVar293._0_8_ = 0x7fc000007fc00000;
            auVar293._12_4_ = 0x7fc00000;
            auVar33 = vblendvps_avx(auVar80,auVar293,auVar33);
            auVar172._0_4_ = fVar102 * auVar33._0_4_;
            auVar172._4_4_ = fVar130 * auVar33._4_4_;
            auVar172._8_4_ = fVar131 * auVar33._8_4_;
            auVar172._12_4_ = fVar132 * auVar33._12_4_;
            auVar94._0_4_ = auVar172._0_4_ * 0.63661975;
            auVar94._4_4_ = auVar172._4_4_ * 0.63661975;
            auVar94._8_4_ = auVar172._8_4_ * 0.63661975;
            auVar94._12_4_ = auVar172._12_4_ * 0.63661975;
            auVar33 = vroundps_avx(auVar94,1);
            auVar279._0_4_ = auVar33._0_4_ * 1.5707964;
            auVar279._4_4_ = auVar33._4_4_ * 1.5707964;
            auVar279._8_4_ = auVar33._8_4_ * 1.5707964;
            auVar279._12_4_ = auVar33._12_4_ * 1.5707964;
            auVar80 = vsubps_avx(auVar172,auVar279);
            fVar335 = auVar80._0_4_;
            fVar187 = fVar335 * fVar335;
            fVar342 = auVar80._4_4_;
            fVar207 = fVar342 * fVar342;
            fVar343 = auVar80._8_4_;
            fVar209 = fVar343 * fVar343;
            fVar344 = auVar80._12_4_;
            fVar211 = fVar344 * fVar344;
            auVar324._0_4_ =
                 fVar335 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar324._4_4_ =
                 fVar342 * (fVar207 * (fVar207 * (fVar207 * (fVar207 * (fVar207 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar324._8_4_ =
                 fVar343 * (fVar209 * (fVar209 * (fVar209 * (fVar209 * (fVar209 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar324._12_4_ =
                 fVar344 * (fVar211 * (fVar211 * (fVar211 * (fVar211 * (fVar211 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar82 = vcvtps2dq_avx(auVar33);
            auVar330._8_4_ = 1;
            auVar330._0_8_ = 0x100000001;
            auVar330._12_4_ = 1;
            auVar33 = vandpd_avx(auVar330,auVar82);
            auVar81 = vpcmpeqd_avx(auVar33,auVar84);
            auVar33 = vpsubd_avx(auVar84,auVar33);
            auVar294._0_4_ =
                 fVar187 * (fVar187 * (fVar187 * (fVar187 * (fVar187 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar294._4_4_ =
                 fVar207 * (fVar207 * (fVar207 * (fVar207 * (fVar207 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar294._8_4_ =
                 fVar209 * (fVar209 * (fVar209 * (fVar209 * (fVar209 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar294._12_4_ =
                 fVar211 * (fVar211 * (fVar211 * (fVar211 * (fVar211 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar80 = vblendvps_avx(auVar324,auVar294,auVar33);
            auVar81 = vblendvps_avx(auVar324,auVar294,auVar81);
            auVar325._8_4_ = 3;
            auVar325._0_8_ = 0x300000003;
            auVar325._12_4_ = 3;
            auVar33 = vandpd_avx(auVar325,auVar82);
            auVar82 = vpcmpeqd_avx(auVar82,auVar82);
            auVar82 = vpaddd_avx(auVar33,auVar82);
            auVar84 = vpminud_avx(auVar82,auVar330);
            auVar82 = vpcmpeqd_avx(auVar84,auVar82);
            auVar340._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar340._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar340._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar81 = vblendvps_avx(auVar81,auVar340,auVar82);
            auVar33 = vpcmpgtd_avx(auVar33,auVar330);
            auVar254._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
            auVar254._8_4_ = auVar80._8_4_ ^ 0x80000000;
            auVar254._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar33 = vblendvps_avx(auVar254,auVar80,auVar33);
            auVar80 = vfmsub213ps_fma(_local_2b8,auVar83,auVar34);
            auVar82 = vfmsub213ps_fma(local_248,auVar83,auVar114);
            fVar335 = auVar80._0_4_;
            fVar209 = auVar80._4_4_;
            fVar212 = auVar80._8_4_;
            fVar10 = auVar80._12_4_;
            fVar342 = auVar82._0_4_;
            fVar211 = auVar82._4_4_;
            fVar7 = auVar82._8_4_;
            fVar11 = auVar82._12_4_;
            auVar80 = vfmsub213ps_fma(_local_2a8,auVar83,auVar56);
            fVar343 = auVar80._0_4_;
            fVar188 = auVar80._4_4_;
            fVar8 = auVar80._8_4_;
            fVar12 = auVar80._12_4_;
            auVar80 = vfmsub213ps_fma(_local_2f8,auVar83,auVar79);
            fVar344 = auVar80._0_4_;
            fVar208 = auVar80._4_4_;
            fVar9 = auVar80._8_4_;
            fVar13 = auVar80._12_4_;
            auVar280._0_4_ =
                 fVar344 * fVar344 + fVar343 * fVar343 + fVar335 * fVar335 + fVar342 * fVar342;
            auVar280._4_4_ =
                 fVar208 * fVar208 + fVar188 * fVar188 + fVar209 * fVar209 + fVar211 * fVar211;
            auVar280._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar212 * fVar212 + fVar7 * fVar7;
            auVar280._12_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11;
            auVar80 = vrsqrtps_avx(auVar280);
            fVar187 = auVar80._0_4_;
            fVar207 = auVar80._4_4_;
            fVar210 = auVar80._8_4_;
            fVar352 = auVar80._12_4_;
            auVar144._0_4_ = auVar280._0_4_ * -0.5 * fVar187 * fVar187 * fVar187;
            auVar144._4_4_ = auVar280._4_4_ * -0.5 * fVar207 * fVar207 * fVar207;
            auVar144._8_4_ = auVar280._8_4_ * -0.5 * fVar210 * fVar210 * fVar210;
            auVar144._12_4_ = auVar280._12_4_ * -0.5 * fVar352 * fVar352 * fVar352;
            auVar281._8_4_ = 0x3fc00000;
            auVar281._0_8_ = 0x3fc000003fc00000;
            auVar281._12_4_ = 0x3fc00000;
            auVar80 = vfmadd231ps_fma(auVar144,auVar281,auVar80);
            fVar187 = auVar80._0_4_;
            fVar210 = auVar80._4_4_;
            fVar352 = auVar80._8_4_;
            fVar14 = auVar80._12_4_;
            fVar207 = auVar33._0_4_;
            auVar255._0_4_ = fVar335 * fVar187 * fVar207;
            fVar335 = auVar33._4_4_;
            auVar255._4_4_ = fVar209 * fVar210 * fVar335;
            fVar209 = auVar33._8_4_;
            auVar255._8_4_ = fVar212 * fVar352 * fVar209;
            fVar212 = auVar33._12_4_;
            auVar255._12_4_ = fVar10 * fVar14 * fVar212;
            auVar295._0_4_ = fVar342 * fVar187 * fVar207;
            auVar295._4_4_ = fVar211 * fVar210 * fVar335;
            auVar295._8_4_ = fVar7 * fVar352 * fVar209;
            auVar295._12_4_ = fVar11 * fVar14 * fVar212;
            auVar326._0_4_ = fVar343 * fVar187 * fVar207;
            auVar326._4_4_ = fVar188 * fVar210 * fVar335;
            auVar326._8_4_ = fVar8 * fVar352 * fVar209;
            auVar326._12_4_ = fVar12 * fVar14 * fVar212;
            auVar331._0_4_ = fVar207 * fVar344 * fVar187;
            auVar331._4_4_ = fVar335 * fVar208 * fVar210;
            auVar331._8_4_ = fVar209 * fVar9 * fVar352;
            auVar331._12_4_ = fVar212 * fVar13 * fVar14;
            auVar80 = vfmadd231ps_fma(auVar255,auVar81,_local_2b8);
            auVar82 = vfmadd231ps_fma(auVar295,auVar81,local_248);
            auVar84 = vfmadd231ps_fma(auVar326,auVar81,_local_2a8);
            auVar81 = vfmadd231ps_fma(auVar331,_local_2f8,auVar81);
            auVar33 = vsubps_avx(auVar34,_local_2b8);
            auVar34 = vfmadd213ps_fma(auVar33,auVar35,_local_2b8);
            auVar33 = vsubps_avx(auVar114,local_248);
            auVar114 = vfmadd213ps_fma(auVar33,auVar35,local_248);
            auVar33 = vsubps_avx(auVar56,_local_2a8);
            auVar56 = vfmadd213ps_fma(auVar33,auVar35,_local_2a8);
            auVar33 = vsubps_avx(auVar79,_local_2f8);
            auVar33 = vfmadd213ps_fma(auVar33,auVar35,_local_2f8);
            fVar335 = auVar34._0_4_;
            fVar207 = auVar34._4_4_;
            fVar210 = auVar34._8_4_;
            fVar352 = auVar34._12_4_;
            fVar342 = auVar114._0_4_;
            fVar209 = auVar114._4_4_;
            fVar212 = auVar114._8_4_;
            fVar10 = auVar114._12_4_;
            fVar343 = auVar56._0_4_;
            fVar211 = auVar56._4_4_;
            fVar7 = auVar56._8_4_;
            fVar11 = auVar56._12_4_;
            fVar344 = auVar33._0_4_;
            fVar188 = auVar33._4_4_;
            fVar8 = auVar33._8_4_;
            fVar12 = auVar33._12_4_;
            auVar221._0_4_ =
                 fVar344 * fVar344 + fVar343 * fVar343 + fVar335 * fVar335 + fVar342 * fVar342;
            auVar221._4_4_ =
                 fVar188 * fVar188 + fVar211 * fVar211 + fVar207 * fVar207 + fVar209 * fVar209;
            auVar221._8_4_ = fVar8 * fVar8 + fVar7 * fVar7 + fVar210 * fVar210 + fVar212 * fVar212;
            auVar221._12_4_ =
                 fVar12 * fVar12 + fVar11 * fVar11 + fVar352 * fVar352 + fVar10 * fVar10;
            auVar33 = vrsqrtps_avx(auVar221);
            fVar187 = auVar33._0_4_;
            fVar208 = auVar33._4_4_;
            fVar9 = auVar33._8_4_;
            fVar13 = auVar33._12_4_;
            auVar173._0_4_ = auVar221._0_4_ * -0.5 * fVar187 * fVar187 * fVar187;
            auVar173._4_4_ = auVar221._4_4_ * -0.5 * fVar208 * fVar208 * fVar208;
            auVar173._8_4_ = auVar221._8_4_ * -0.5 * fVar9 * fVar9 * fVar9;
            auVar173._12_4_ = auVar221._12_4_ * -0.5 * fVar13 * fVar13 * fVar13;
            auVar33 = vfmadd231ps_fma(auVar173,auVar33,auVar281);
            fVar187 = auVar33._0_4_;
            auVar95._0_4_ = fVar335 * fVar187;
            fVar335 = auVar33._4_4_;
            auVar95._4_4_ = fVar207 * fVar335;
            fVar207 = auVar33._8_4_;
            auVar95._8_4_ = fVar210 * fVar207;
            fVar208 = auVar33._12_4_;
            auVar95._12_4_ = fVar352 * fVar208;
            auVar145._0_4_ = fVar342 * fVar187;
            auVar145._4_4_ = fVar209 * fVar335;
            auVar145._8_4_ = fVar212 * fVar207;
            auVar145._12_4_ = fVar10 * fVar208;
            auVar222._0_4_ = fVar343 * fVar187;
            auVar222._4_4_ = fVar211 * fVar335;
            auVar222._8_4_ = fVar7 * fVar207;
            auVar222._12_4_ = fVar11 * fVar208;
            auVar174._0_4_ = fVar344 * fVar187;
            auVar174._4_4_ = fVar188 * fVar335;
            auVar174._8_4_ = fVar8 * fVar207;
            auVar174._12_4_ = fVar12 * fVar208;
            auVar126._8_4_ = 0x3f7fdf3b;
            auVar126._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar126._12_4_ = 0x3f7fdf3b;
            auVar56 = vcmpps_avx(auVar83,auVar126,6);
            auVar33 = vblendvps_avx(auVar80,auVar95,auVar56);
            auVar34 = vblendvps_avx(auVar82,auVar145,auVar56);
            auVar114 = vblendvps_avx(auVar84,auVar222,auVar56);
            auVar56 = vblendvps_avx(auVar81,auVar174,auVar56);
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar35 = vsubps_avx(auVar146,auVar35);
            auVar175._0_4_ = fVar102 * (float)local_208._0_4_;
            auVar175._4_4_ = fVar130 * (float)local_208._4_4_;
            auVar175._8_4_ = fVar131 * fStack_200;
            auVar175._12_4_ = fVar132 * fStack_1fc;
            auVar80 = vfmadd213ps_fma(local_328,auVar35,auVar175);
            auVar176._0_4_ = fVar102 * (float)local_1f8._0_4_;
            auVar176._4_4_ = fVar130 * (float)local_1f8._4_4_;
            auVar176._8_4_ = fVar131 * fStack_1f0;
            auVar176._12_4_ = fVar132 * fStack_1ec;
            auVar81 = vfmadd213ps_fma(_local_348,auVar35,auVar176);
            auVar177._0_4_ = fVar102 * (float)local_1e8._0_4_;
            auVar177._4_4_ = fVar130 * (float)local_1e8._4_4_;
            auVar177._8_4_ = fVar131 * fStack_1e0;
            auVar177._12_4_ = fVar132 * fStack_1dc;
            auVar82 = vfmadd213ps_fma(_local_338,auVar35,auVar177);
            auVar178._0_4_ = fVar102 * (float)local_288._0_4_;
            auVar178._4_4_ = fVar130 * (float)local_288._4_4_;
            auVar178._8_4_ = fVar131 * fStack_280;
            auVar178._12_4_ = fVar132 * fStack_27c;
            auVar83 = vfmadd213ps_fma(local_2e8,auVar35,auVar178);
            auVar179._0_4_ = fVar102 * (float)local_118._0_4_;
            auVar179._4_4_ = fVar130 * (float)local_118._4_4_;
            auVar179._8_4_ = fVar131 * fStack_110;
            auVar179._12_4_ = fVar132 * fStack_10c;
            auVar84 = vfmadd213ps_fma(_local_368,auVar35,auVar179);
            auVar180._0_4_ = fVar102 * (float)local_1d8._0_4_;
            auVar180._4_4_ = fVar130 * (float)local_1d8._4_4_;
            auVar180._8_4_ = fVar131 * fStack_1d0;
            auVar180._12_4_ = fVar132 * fStack_1cc;
            auVar253 = vfmadd213ps_fma(_local_358,auVar35,auVar180);
            auVar181._0_4_ = fVar102 * (float)local_278._0_4_;
            auVar181._4_4_ = fVar130 * (float)local_278._4_4_;
            auVar181._8_4_ = fVar131 * fStack_270;
            auVar181._12_4_ = fVar132 * fStack_26c;
            auVar292 = vfmadd213ps_fma(_local_388,auVar35,auVar181);
            auVar182._0_4_ = fVar102 * (float)local_1c8._0_4_;
            auVar182._4_4_ = fVar130 * (float)local_1c8._4_4_;
            auVar182._8_4_ = fVar131 * fStack_1c0;
            auVar182._12_4_ = fVar132 * fStack_1bc;
            auVar85 = vfmadd213ps_fma(_local_2c8,auVar35,auVar182);
            auVar183._0_4_ = fVar102 * (float)local_1b8._0_4_;
            auVar183._4_4_ = fVar130 * (float)local_1b8._4_4_;
            auVar183._8_4_ = fVar131 * fStack_1b0;
            auVar183._12_4_ = fVar132 * fStack_1ac;
            auVar86 = vfmadd213ps_fma(_local_308,auVar35,auVar183);
            auVar184._0_4_ = fVar102 * (float)local_268._0_4_;
            auVar184._4_4_ = fVar130 * (float)local_268._4_4_;
            auVar184._8_4_ = fVar131 * fStack_260;
            auVar184._12_4_ = fVar132 * fStack_25c;
            auVar223._0_4_ = fVar102 * (float)local_1a8._0_4_;
            auVar223._4_4_ = fVar130 * (float)local_1a8._4_4_;
            auVar223._8_4_ = fVar131 * fStack_1a0;
            auVar223._12_4_ = fVar132 * fStack_19c;
            auVar242._0_4_ = fVar102 * (float)local_198._0_4_;
            auVar242._4_4_ = fVar130 * (float)local_198._4_4_;
            auVar242._8_4_ = fVar131 * fStack_190;
            auVar242._12_4_ = fVar132 * fStack_18c;
            auVar87 = vfmadd213ps_fma(_local_378,auVar35,auVar184);
            auVar88 = vfmadd213ps_fma(local_2d8,auVar35,auVar223);
            auVar140 = vfmadd213ps_fma(_local_318,auVar35,auVar242);
            fVar102 = auVar114._0_4_;
            fVar188 = auVar34._0_4_;
            auVar185._0_4_ = fVar188 * fVar102;
            fVar131 = auVar114._4_4_;
            fVar208 = auVar34._4_4_;
            auVar185._4_4_ = fVar208 * fVar131;
            fVar335 = auVar114._8_4_;
            fVar210 = auVar34._8_4_;
            auVar185._8_4_ = fVar210 * fVar335;
            fVar343 = auVar114._12_4_;
            fVar212 = auVar34._12_4_;
            auVar185._12_4_ = fVar212 * fVar343;
            fVar130 = auVar56._0_4_;
            fVar187 = auVar33._0_4_;
            auVar224._0_4_ = fVar187 * fVar130;
            fVar132 = auVar56._4_4_;
            fVar207 = auVar33._4_4_;
            auVar224._4_4_ = fVar207 * fVar132;
            fVar342 = auVar56._8_4_;
            fVar209 = auVar33._8_4_;
            auVar224._8_4_ = fVar209 * fVar342;
            fVar344 = auVar56._12_4_;
            fVar211 = auVar33._12_4_;
            auVar224._12_4_ = fVar211 * fVar344;
            auVar33 = vsubps_avx(auVar185,auVar224);
            auVar225._0_4_ = fVar187 * fVar187;
            auVar225._4_4_ = fVar207 * fVar207;
            auVar225._8_4_ = fVar209 * fVar209;
            auVar225._12_4_ = fVar211 * fVar211;
            auVar243._0_4_ = fVar188 * fVar188;
            auVar243._4_4_ = fVar208 * fVar208;
            auVar243._8_4_ = fVar210 * fVar210;
            auVar243._12_4_ = fVar212 * fVar212;
            auVar256._0_4_ = auVar225._0_4_ + auVar243._0_4_;
            auVar256._4_4_ = auVar225._4_4_ + auVar243._4_4_;
            auVar256._8_4_ = auVar225._8_4_ + auVar243._8_4_;
            auVar256._12_4_ = auVar225._12_4_ + auVar243._12_4_;
            auVar34 = vsubps_avx(auVar225,auVar243);
            auVar226._0_4_ = fVar188 * fVar130;
            auVar226._4_4_ = fVar208 * fVar132;
            auVar226._8_4_ = fVar210 * fVar342;
            auVar226._12_4_ = fVar212 * fVar344;
            auVar204._0_4_ = fVar187 * fVar188;
            auVar204._4_4_ = fVar207 * fVar208;
            auVar204._8_4_ = fVar209 * fVar210;
            auVar204._12_4_ = fVar211 * fVar212;
            auVar127._0_4_ = fVar187 * fVar102;
            auVar127._4_4_ = fVar207 * fVar131;
            auVar127._8_4_ = fVar209 * fVar335;
            auVar127._12_4_ = fVar211 * fVar343;
            auVar35 = vsubps_avx(auVar226,auVar127);
            auVar227._0_4_ = fVar102 * fVar130;
            auVar227._4_4_ = fVar131 * fVar132;
            auVar227._8_4_ = fVar335 * fVar342;
            auVar227._12_4_ = fVar343 * fVar344;
            auVar114 = vsubps_avx(auVar227,auVar204);
            auVar48._0_4_ = fVar102 * fVar102;
            auVar48._4_4_ = fVar131 * fVar131;
            auVar48._8_4_ = fVar335 * fVar335;
            auVar48._12_4_ = fVar343 * fVar343;
            auVar56 = vsubps_avx(auVar256,auVar48);
            auVar257._0_4_ = auVar48._0_4_ + auVar34._0_4_;
            auVar257._4_4_ = auVar48._4_4_ + auVar34._4_4_;
            auVar257._8_4_ = auVar48._8_4_ + auVar34._8_4_;
            auVar257._12_4_ = auVar48._12_4_ + auVar34._12_4_;
            auVar34 = vsubps_avx(auVar34,auVar48);
            auVar96._0_4_ = fVar130 * fVar130;
            auVar96._4_4_ = fVar132 * fVar132;
            auVar96._8_4_ = fVar342 * fVar342;
            auVar96._12_4_ = fVar344 * fVar344;
            auVar56 = vsubps_avx(auVar56,auVar96);
            auVar79 = vsubps_avx(auVar257,auVar96);
            auVar49._0_4_ = auVar96._0_4_ + auVar34._0_4_;
            auVar49._4_4_ = auVar96._4_4_ + auVar34._4_4_;
            auVar49._8_4_ = auVar96._8_4_ + auVar34._8_4_;
            auVar49._12_4_ = auVar96._12_4_ + auVar34._12_4_;
            auVar147._0_4_ = auVar185._0_4_ + auVar224._0_4_ + auVar185._0_4_ + auVar224._0_4_;
            auVar147._4_4_ = auVar185._4_4_ + auVar224._4_4_ + auVar185._4_4_ + auVar224._4_4_;
            auVar147._8_4_ = auVar185._8_4_ + auVar224._8_4_ + auVar185._8_4_ + auVar224._8_4_;
            auVar147._12_4_ = auVar185._12_4_ + auVar224._12_4_ + auVar185._12_4_ + auVar224._12_4_;
            auVar97._0_4_ = auVar35._0_4_ + auVar35._0_4_;
            auVar97._4_4_ = auVar35._4_4_ + auVar35._4_4_;
            auVar97._8_4_ = auVar35._8_4_ + auVar35._8_4_;
            auVar97._12_4_ = auVar35._12_4_ + auVar35._12_4_;
            auVar91 = ZEXT416(0) << 0x20;
            auVar244._0_4_ = auVar97._0_4_ * 0.0;
            auVar244._4_4_ = auVar97._4_4_ * 0.0;
            auVar244._8_4_ = auVar97._8_4_ * 0.0;
            auVar244._12_4_ = auVar97._12_4_ * 0.0;
            auVar34 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar147,auVar244);
            auVar332._0_4_ = auVar147._0_4_ + auVar244._0_4_;
            auVar332._4_4_ = auVar147._4_4_ + auVar244._4_4_;
            auVar332._8_4_ = auVar147._8_4_ + auVar244._8_4_;
            auVar332._12_4_ = auVar147._12_4_ + auVar244._12_4_;
            auVar35 = vfmadd213ps_fma(auVar147,auVar91,auVar97);
            auVar98._0_4_ = auVar227._0_4_ + auVar204._0_4_ + auVar227._0_4_ + auVar204._0_4_;
            auVar98._4_4_ = auVar227._4_4_ + auVar204._4_4_ + auVar227._4_4_ + auVar204._4_4_;
            auVar98._8_4_ = auVar227._8_4_ + auVar204._8_4_ + auVar227._8_4_ + auVar204._8_4_;
            auVar98._12_4_ = auVar227._12_4_ + auVar204._12_4_ + auVar227._12_4_ + auVar204._12_4_;
            auVar245._0_4_ = auVar98._0_4_ * 0.0;
            auVar245._4_4_ = auVar98._4_4_ * 0.0;
            auVar245._8_4_ = auVar98._8_4_ * 0.0;
            auVar245._12_4_ = auVar98._12_4_ * 0.0;
            auVar141 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar79,auVar245);
            auVar296._0_4_ = auVar79._0_4_ + auVar245._0_4_;
            auVar296._4_4_ = auVar79._4_4_ + auVar245._4_4_;
            auVar296._8_4_ = auVar79._8_4_ + auVar245._8_4_;
            auVar296._12_4_ = auVar79._12_4_ + auVar245._12_4_;
            auVar79 = vfmadd213ps_fma(auVar79,auVar91,auVar98);
            auVar99._0_4_ = auVar33._0_4_ + auVar33._0_4_;
            auVar99._4_4_ = auVar33._4_4_ + auVar33._4_4_;
            auVar99._8_4_ = auVar33._8_4_ + auVar33._8_4_;
            auVar99._12_4_ = auVar33._12_4_ + auVar33._12_4_;
            auVar246._0_4_ = auVar141._0_4_ + auVar99._0_4_;
            auVar246._4_4_ = auVar141._4_4_ + auVar99._4_4_;
            auVar246._8_4_ = auVar141._8_4_ + auVar99._8_4_;
            auVar246._12_4_ = auVar141._12_4_ + auVar99._12_4_;
            auVar141 = vfmadd231ps_fma(auVar296,auVar99,auVar91);
            auVar322 = vfmadd231ps_fma(auVar79,auVar91,auVar99);
            auVar349._0_4_ = auVar114._0_4_ + auVar114._0_4_;
            auVar349._4_4_ = auVar114._4_4_ + auVar114._4_4_;
            auVar349._8_4_ = auVar114._8_4_ + auVar114._8_4_;
            auVar349._12_4_ = auVar114._12_4_ + auVar114._12_4_;
            auVar100._0_4_ = auVar49._0_4_ * 0.0;
            auVar100._4_4_ = auVar49._4_4_ * 0.0;
            auVar100._8_4_ = auVar49._8_4_ * 0.0;
            auVar100._12_4_ = auVar49._12_4_ * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar349,auVar100);
            auVar282._0_4_ = auVar349._0_4_ + auVar100._0_4_;
            auVar282._4_4_ = auVar349._4_4_ + auVar100._4_4_;
            auVar282._8_4_ = auVar349._8_4_ + auVar100._8_4_;
            auVar282._12_4_ = auVar349._12_4_ + auVar100._12_4_;
            auVar114 = vfmadd213ps_fma(auVar349,auVar91,auVar49);
            auVar50._0_4_ = auVar226._0_4_ + auVar127._0_4_ + auVar226._0_4_ + auVar127._0_4_;
            auVar50._4_4_ = auVar226._4_4_ + auVar127._4_4_ + auVar226._4_4_ + auVar127._4_4_;
            auVar50._8_4_ = auVar226._8_4_ + auVar127._8_4_ + auVar226._8_4_ + auVar127._8_4_;
            auVar50._12_4_ = auVar226._12_4_ + auVar127._12_4_ + auVar226._12_4_ + auVar127._12_4_;
            fVar335 = auVar50._0_4_ + auVar33._0_4_;
            fVar342 = auVar50._4_4_ + auVar33._4_4_;
            fVar343 = auVar50._8_4_ + auVar33._8_4_;
            fVar344 = auVar50._12_4_ + auVar33._12_4_;
            auVar79 = vfmadd231ps_fma(auVar282,auVar50,auVar91);
            auVar114 = vfmadd231ps_fma(auVar114,auVar91,auVar50);
            auVar89 = vfmadd231ps_fma(auVar332,auVar56,auVar91);
            auVar90 = vfmadd231ps_fma(auVar35,auVar91,auVar56);
            local_348._0_4_ = auVar81._0_4_;
            local_348._4_4_ = auVar81._4_4_;
            fStack_340 = auVar81._8_4_;
            fStack_33c = auVar81._12_4_;
            local_338._0_4_ = auVar82._0_4_;
            local_338._4_4_ = auVar82._4_4_;
            uStack_330._0_4_ = auVar82._8_4_;
            uStack_330._4_4_ = auVar82._12_4_;
            local_358._0_4_ = auVar253._0_4_;
            local_358._4_4_ = auVar253._4_4_;
            uStack_350._0_4_ = auVar253._8_4_;
            uStack_350._4_4_ = auVar253._12_4_;
            auVar267._0_4_ = fVar335 * 0.0;
            auVar267._4_4_ = fVar342 * 0.0;
            auVar267._8_4_ = fVar343 * 0.0;
            auVar267._12_4_ = fVar344 * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar246,auVar267);
            fVar102 = auVar79._0_4_;
            auVar258._0_4_ = fVar102 * 0.0;
            fVar130 = auVar79._4_4_;
            auVar258._4_4_ = fVar130 * 0.0;
            fVar131 = auVar79._8_4_;
            auVar258._8_4_ = fVar131 * 0.0;
            fVar132 = auVar79._12_4_;
            auVar258._12_4_ = fVar132 * 0.0;
            auVar35 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar141,auVar258);
            fVar187 = auVar114._0_4_;
            auVar51._0_4_ = fVar187 * 0.0;
            fVar207 = auVar114._4_4_;
            auVar51._4_4_ = fVar207 * 0.0;
            fVar209 = auVar114._8_4_;
            auVar51._8_4_ = fVar209 * 0.0;
            fVar211 = auVar114._12_4_;
            auVar51._12_4_ = fVar211 * 0.0;
            auVar114 = vfmadd213ps_fma(auVar91,auVar322,auVar51);
            auVar81 = vfmadd231ps_fma(auVar267,auVar84,auVar246);
            auVar82 = vfmadd231ps_fma(auVar258,auVar84,auVar141);
            auVar79 = vfmadd213ps_fma(auVar84,auVar322,auVar51);
            local_308._0_4_ = auVar86._0_4_;
            local_308._4_4_ = auVar86._4_4_;
            uStack_300._0_4_ = auVar86._8_4_;
            uStack_300._4_4_ = auVar86._12_4_;
            auVar128._0_4_ = fVar335 * (float)local_308._0_4_;
            auVar128._4_4_ = fVar342 * (float)local_308._4_4_;
            auVar128._8_4_ = fVar343 * (float)uStack_300;
            auVar128._12_4_ = fVar344 * uStack_300._4_4_;
            auVar101._0_4_ = fVar102 * (float)local_308._0_4_;
            auVar101._4_4_ = fVar130 * (float)local_308._4_4_;
            auVar101._8_4_ = fVar131 * (float)uStack_300;
            auVar101._12_4_ = fVar132 * uStack_300._4_4_;
            auVar52._0_4_ = fVar187 * (float)local_308._0_4_;
            auVar52._4_4_ = fVar207 * (float)local_308._4_4_;
            auVar52._8_4_ = fVar209 * (float)uStack_300;
            auVar52._12_4_ = fVar211 * uStack_300._4_4_;
            auVar84 = vfmadd231ps_fma(auVar128,auVar85,auVar246);
            auVar253 = vfmadd231ps_fma(auVar101,auVar85,auVar141);
            auVar85 = vfmadd231ps_fma(auVar52,auVar322,auVar85);
            local_318._0_4_ = auVar140._0_4_;
            local_318._4_4_ = auVar140._4_4_;
            uStack_310._0_4_ = auVar140._8_4_;
            uStack_310._4_4_ = auVar140._12_4_;
            auVar341._0_4_ = fVar335 * (float)local_318._0_4_;
            auVar341._4_4_ = fVar342 * (float)local_318._4_4_;
            auVar341._8_4_ = fVar343 * (float)uStack_310;
            auVar341._12_4_ = fVar344 * uStack_310._4_4_;
            auVar283._0_4_ = fVar102 * (float)local_318._0_4_;
            auVar283._4_4_ = fVar130 * (float)local_318._4_4_;
            auVar283._8_4_ = fVar131 * (float)uStack_310;
            auVar283._12_4_ = fVar132 * uStack_310._4_4_;
            auVar350._0_4_ = fVar187 * (float)local_318._0_4_;
            auVar350._4_4_ = fVar207 * (float)local_318._4_4_;
            auVar350._8_4_ = fVar209 * (float)uStack_310;
            auVar350._12_4_ = fVar211 * uStack_310._4_4_;
            auVar86 = vfmadd231ps_fma(auVar341,auVar88,auVar246);
            auVar140 = vfmadd231ps_fma(auVar283,auVar88,auVar141);
            auVar88 = vfmadd231ps_fma(auVar350,auVar88,auVar322);
            local_2b8._0_4_ = auVar56._0_4_;
            local_2b8._4_4_ = auVar56._4_4_;
            fStack_2b0 = auVar56._8_4_;
            fStack_2ac = auVar56._12_4_;
            local_398._0_4_ = auVar34._0_4_;
            local_398._4_4_ = auVar34._4_4_;
            fStack_390 = auVar34._8_4_;
            fStack_38c = auVar34._12_4_;
            auVar205._0_4_ = (float)local_2b8._0_4_ + (float)local_398._0_4_;
            auVar205._4_4_ = (float)local_2b8._4_4_ + (float)local_398._4_4_;
            auVar205._8_4_ = fStack_2b0 + fStack_390;
            auVar205._12_4_ = fStack_2ac + fStack_38c;
            auVar33 = vfmadd231ps_fma(auVar33,auVar80,auVar205);
            auVar34 = vfmadd231ps_fma(auVar35,auVar80,auVar89);
            auVar35 = vfmadd231ps_fma(auVar114,auVar90,auVar80);
            auVar114 = vfmadd231ps_fma(auVar81,auVar83,auVar205);
            auVar56 = vfmadd231ps_fma(auVar82,auVar83,auVar89);
            auVar79 = vfmadd231ps_fma(auVar79,auVar90,auVar83);
            auVar80 = vfmadd231ps_fma(auVar84,auVar292,auVar205);
            auVar81 = vfmadd231ps_fma(auVar253,auVar292,auVar89);
            auVar82 = vfmadd231ps_fma(auVar85,auVar90,auVar292);
            auVar83 = vfmadd231ps_fma(auVar86,auVar87,auVar205);
            local_368._4_4_ = auVar83._4_4_ + (float)local_348._4_4_ + 0.0;
            local_368._0_4_ = auVar83._0_4_ + (float)local_348._0_4_ + 0.0;
            fStack_360 = auVar83._8_4_ + fStack_340 + 0.0;
            fStack_35c = auVar83._12_4_ + fStack_33c + 0.0;
            auVar83 = vfmadd231ps_fma(auVar140,auVar87,auVar89);
            local_388._4_4_ = auVar83._4_4_ + (float)local_338._4_4_ + 0.0;
            local_388._0_4_ = auVar83._0_4_ + (float)local_338._0_4_ + 0.0;
            fStack_380 = auVar83._8_4_ + (float)uStack_330 + 0.0;
            fStack_37c = auVar83._12_4_ + uStack_330._4_4_ + 0.0;
            auVar83 = vfmadd231ps_fma(auVar88,auVar87,auVar90);
            fVar102 = auVar83._0_4_ + (float)local_358._0_4_ + 0.0;
            fVar130 = auVar83._4_4_ + (float)local_358._4_4_ + 0.0;
            fVar131 = auVar83._8_4_ + (float)uStack_350 + 0.0;
            fVar132 = auVar83._12_4_ + uStack_350._4_4_ + 0.0;
            auVar186._0_4_ = auVar81._0_4_ * auVar79._0_4_;
            auVar186._4_4_ = auVar81._4_4_ * auVar79._4_4_;
            auVar186._8_4_ = auVar81._8_4_ * auVar79._8_4_;
            auVar186._12_4_ = auVar81._12_4_ * auVar79._12_4_;
            auVar83 = vfmsub231ps_fma(auVar186,auVar56,auVar82);
            auVar206._0_4_ = auVar114._0_4_ * auVar82._0_4_;
            auVar206._4_4_ = auVar114._4_4_ * auVar82._4_4_;
            auVar206._8_4_ = auVar114._8_4_ * auVar82._8_4_;
            auVar206._12_4_ = auVar114._12_4_ * auVar82._12_4_;
            auVar84 = vfmsub231ps_fma(auVar206,auVar79,auVar80);
            auVar284._0_4_ = auVar56._0_4_ * auVar80._0_4_;
            auVar284._4_4_ = auVar56._4_4_ * auVar80._4_4_;
            auVar284._8_4_ = auVar56._8_4_ * auVar80._8_4_;
            auVar284._12_4_ = auVar56._12_4_ * auVar80._12_4_;
            auVar253 = vfmsub231ps_fma(auVar284,auVar114,auVar81);
            fVar335 = auVar35._0_4_;
            auVar333._0_4_ = fVar335 * auVar80._0_4_;
            fVar342 = auVar35._4_4_;
            auVar333._4_4_ = fVar342 * auVar80._4_4_;
            fVar343 = auVar35._8_4_;
            auVar333._8_4_ = fVar343 * auVar80._8_4_;
            fVar344 = auVar35._12_4_;
            auVar333._12_4_ = fVar344 * auVar80._12_4_;
            auVar292 = vfmsub231ps_fma(auVar333,auVar33,auVar82);
            auVar351._0_4_ = auVar34._0_4_ * auVar82._0_4_;
            auVar351._4_4_ = auVar34._4_4_ * auVar82._4_4_;
            auVar351._8_4_ = auVar34._8_4_ * auVar82._8_4_;
            auVar351._12_4_ = auVar34._12_4_ * auVar82._12_4_;
            auVar82 = vfmsub231ps_fma(auVar351,auVar81,auVar35);
            auVar297._0_4_ = auVar33._0_4_ * auVar81._0_4_;
            auVar297._4_4_ = auVar33._4_4_ * auVar81._4_4_;
            auVar297._8_4_ = auVar33._8_4_ * auVar81._8_4_;
            auVar297._12_4_ = auVar33._12_4_ * auVar81._12_4_;
            auVar80 = vfmsub231ps_fma(auVar297,auVar34,auVar80);
            auVar129._0_4_ = auVar56._0_4_ * fVar335;
            auVar129._4_4_ = auVar56._4_4_ * fVar342;
            auVar129._8_4_ = auVar56._8_4_ * fVar343;
            auVar129._12_4_ = auVar56._12_4_ * fVar344;
            auVar81 = vfmsub231ps_fma(auVar129,auVar34,auVar79);
            auVar148._0_4_ = auVar33._0_4_ * auVar79._0_4_;
            auVar148._4_4_ = auVar33._4_4_ * auVar79._4_4_;
            auVar148._8_4_ = auVar33._8_4_ * auVar79._8_4_;
            auVar148._12_4_ = auVar33._12_4_ * auVar79._12_4_;
            auVar79 = vfmsub231ps_fma(auVar148,auVar35,auVar114);
            auVar268._0_4_ = auVar114._0_4_ * auVar34._0_4_;
            auVar268._4_4_ = auVar114._4_4_ * auVar34._4_4_;
            auVar268._8_4_ = auVar114._8_4_ * auVar34._8_4_;
            auVar268._12_4_ = auVar114._12_4_ * auVar34._12_4_;
            auVar85 = vfmsub231ps_fma(auVar268,auVar33,auVar56);
            auVar228._0_4_ = fVar335 * auVar253._0_4_;
            auVar228._4_4_ = fVar342 * auVar253._4_4_;
            auVar228._8_4_ = fVar343 * auVar253._8_4_;
            auVar228._12_4_ = fVar344 * auVar253._12_4_;
            auVar34 = vfmadd231ps_fma(auVar228,auVar84,auVar34);
            auVar56 = vfmadd231ps_fma(auVar34,auVar83,auVar33);
            auVar33 = vdivps_avx(auVar83,auVar56);
            auVar34 = vdivps_avx(auVar82,auVar56);
            auVar35 = vdivps_avx(auVar81,auVar56);
            _local_318 = vdivps_avx(auVar84,auVar56);
            auVar114 = vdivps_avx(auVar292,auVar56);
            _local_398 = vdivps_avx(auVar79,auVar56);
            local_328 = vdivps_avx(auVar253,auVar56);
            local_2e8 = vdivps_avx(auVar80,auVar56);
            local_2d8 = vdivps_avx(auVar85,auVar56);
            auVar269._0_4_ = fVar102 * local_328._0_4_;
            auVar269._4_4_ = fVar130 * local_328._4_4_;
            auVar269._8_4_ = fVar131 * local_328._8_4_;
            auVar269._12_4_ = fVar132 * local_328._12_4_;
            auVar285._0_4_ = fVar102 * local_2e8._0_4_;
            auVar285._4_4_ = fVar130 * local_2e8._4_4_;
            auVar285._8_4_ = fVar131 * local_2e8._8_4_;
            auVar285._12_4_ = fVar132 * local_2e8._12_4_;
            auVar327._0_4_ = fVar102 * local_2d8._0_4_;
            auVar327._4_4_ = fVar130 * local_2d8._4_4_;
            auVar327._8_4_ = fVar131 * local_2d8._8_4_;
            auVar327._12_4_ = fVar132 * local_2d8._12_4_;
            auVar56 = vfmadd231ps_fma(auVar269,_local_388,_local_318);
            auVar79 = vfmadd231ps_fma(auVar285,_local_388,auVar114);
            auVar80 = vfmadd231ps_fma(auVar327,_local_398,_local_388);
            _local_378 = _local_368;
          }
          auVar56 = vfmadd231ps_fma(auVar56,_local_378,auVar33);
          auVar79 = vfmadd231ps_fma(auVar79,_local_378,auVar34);
          auVar80 = vfmadd231ps_fma(auVar80,auVar35,_local_378);
          auVar288._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
          auVar288._8_4_ = auVar56._8_4_ ^ 0x80000000;
          auVar288._12_4_ = auVar56._12_4_ ^ 0x80000000;
          auVar272._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
          auVar272._8_4_ = auVar79._8_4_ ^ 0x80000000;
          auVar272._12_4_ = auVar79._12_4_ ^ 0x80000000;
          auVar262._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = auVar80._8_4_ ^ 0x80000000;
          auVar262._12_4_ = auVar80._12_4_ ^ 0x80000000;
          _local_388 = auVar114;
          _local_378 = auVar35;
          _local_368 = auVar34;
        }
        else {
          fVar102 = (pGVar19->time_range).lower;
          auVar24._4_4_ = fVar102;
          auVar24._0_4_ = fVar102;
          auVar24._8_4_ = fVar102;
          auVar24._12_4_ = fVar102;
          fVar130 = pGVar19->fnumTimeSegments;
          auVar56 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar24);
          fVar102 = (pGVar19->time_range).upper - fVar102;
          auVar25._4_4_ = fVar102;
          auVar25._0_4_ = fVar102;
          auVar25._8_4_ = fVar102;
          auVar25._12_4_ = fVar102;
          auVar79 = vdivps_avx(auVar56,auVar25);
          auVar26._0_4_ = fVar130 * auVar79._0_4_;
          auVar26._4_4_ = fVar130 * auVar79._4_4_;
          auVar26._8_4_ = fVar130 * auVar79._8_4_;
          auVar26._12_4_ = fVar130 * auVar79._12_4_;
          auVar79 = vroundps_avx(auVar26,1);
          fVar130 = fVar130 + -1.0;
          auVar103._4_4_ = fVar130;
          auVar103._0_4_ = fVar130;
          auVar103._8_4_ = fVar130;
          auVar103._12_4_ = fVar130;
          auVar79 = vminps_avx(auVar79,auVar103);
          auVar112 = vmaxps_avx(auVar79,ZEXT416(0) << 0x20);
          auVar79 = vsubps_avx(auVar26,auVar112);
          local_108 = vcvtps2dq_avx(auVar112);
          uVar3 = 0;
          for (uVar21 = uVar20 & 0xff; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
            uVar3 = uVar3 + 1;
          }
          iVar4 = *(int *)(local_108 + (ulong)uVar3 * 4);
          auVar27._4_4_ = iVar4;
          auVar27._0_4_ = iVar4;
          auVar27._8_4_ = iVar4;
          auVar27._12_4_ = iVar4;
          auVar80 = vpcmpeqd_avx(local_108,auVar27);
          auVar81 = local_38 & ~auVar80;
          if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar81 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar81 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar81[0xf]) {
            plVar2 = (long *)(*(long *)&pGVar19[1].fnumTimeSegments + (long)iVar4 * 0x38);
            iVar4 = *(int *)(*(long *)&pGVar19[1].fnumTimeSegments + 0x20 + (long)iVar4 * 0x38);
            if (iVar4 == 0x9134) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              uVar3 = *(uint *)(lVar6 + 0xc + lVar22);
              auVar35 = ZEXT416(uVar3);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
              auVar80 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
              auVar56 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
              auVar34 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c)
              ;
              auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar28,0x4c);
              auVar80 = vshufps_avx(auVar33,auVar33,0x78);
              auVar104._8_8_ = 0;
              auVar104._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar104,0x4c);
              auVar56 = vshufps_avx(auVar33,auVar33,0x78);
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar105,0x4c);
              auVar33 = vshufps_avx(auVar33,auVar33,0x78);
              auVar106._8_8_ = 0;
              auVar106._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
              auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar106,0x4c);
              auVar34 = vshufps_avx(auVar34,auVar34,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar33 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
              auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar30);
              auVar35 = vshufps_avx(auVar34,auVar30,0xd8);
              auVar149._8_8_ = 0;
              auVar149._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar149);
              auVar56 = vshufps_avx(auVar34,auVar149,0xd8);
              fVar102 = *(float *)(lVar6 + 0x24 + lVar22);
              fVar130 = *(float *)(lVar6 + 0x28 + lVar22);
              fVar131 = *(float *)(lVar6 + 0x2c + lVar22);
              fVar132 = *(float *)(lVar6 + 0x30 + lVar22);
              auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),ZEXT416((uint)fVar102),
                                        ZEXT416((uint)fVar102));
              auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar131),ZEXT416((uint)fVar131));
              auVar80 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
              auVar34 = vrsqrtss_avx(auVar80,auVar80);
              fVar335 = auVar34._0_4_;
              local_108 = ZEXT416((uint)(fVar335 * 1.5));
              fVar335 = fVar335 * 1.5 + fVar335 * fVar335 * fVar335 * auVar80._0_4_ * -0.5;
              auVar34 = vinsertps_avx(auVar56,ZEXT416((uint)(fVar335 * fVar102)),0x30);
              auVar80 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar335 * fVar130)),0x30);
              auVar35 = ZEXT416((uint)(fVar132 * fVar335));
              auVar56 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
              auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar132 * fVar335)),0x30);
              auVar56 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
              auVar56 = vinsertps_avx(auVar56,ZEXT416((uint)(fVar335 * fVar131)),0x30);
            }
            else if (iVar4 == 0x9244) {
              lVar6 = *plVar2;
              lVar22 = plVar2[2] * uVar18;
              auVar80 = *(undefined1 (*) [16])(lVar6 + lVar22);
              auVar56 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
              auVar33 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
              auVar34 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
            }
            iVar4 = (int)plVar2[0xb];
            if (iVar4 == 0x9134) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
              auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
              auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
              local_108 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
              auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
              auVar292 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
              auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
              auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar107._8_8_ = 0;
              auVar107._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
              auVar35 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar107,0x4c);
              auVar35 = vshufps_avx(auVar35,auVar35,0x78);
              auVar108._8_8_ = 0;
              auVar108._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar108,0x4c);
              local_108 = vshufps_avx(auVar114,auVar114,0x78);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar109,0x4c);
              auVar292 = vshufps_avx(auVar114,auVar114,0x78);
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
              auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar110,0x4c);
              auVar114 = vshufps_avx(auVar114,auVar114,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = plVar2[7];
              lVar22 = uVar18 * plVar2[9];
              auVar111._8_8_ = 0;
              auVar111._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
              auVar81 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
              auVar213._8_8_ = 0;
              auVar213._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
              auVar35 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar213);
              auVar82 = vshufps_avx(auVar35,auVar213,0xd8);
              auVar259._8_8_ = 0;
              auVar259._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
              auVar35 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar259);
              auVar114 = vshufps_avx(auVar35,auVar259,0xd8);
              fVar102 = *(float *)(lVar6 + 0x24 + lVar22);
              fVar130 = *(float *)(lVar6 + 0x28 + lVar22);
              fVar131 = *(float *)(lVar6 + 0x2c + lVar22);
              fVar132 = *(float *)(lVar6 + 0x30 + lVar22);
              auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),ZEXT416((uint)fVar102),
                                        ZEXT416((uint)fVar102));
              auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar131),ZEXT416((uint)fVar131));
              auVar83 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
              auVar35 = vrsqrtss_avx(auVar83,auVar83);
              fVar335 = auVar35._0_4_;
              fVar335 = fVar335 * 1.5 + fVar335 * fVar335 * fVar335 * auVar83._0_4_ * -0.5;
              auVar114 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar102 * fVar335)),0x30);
              auVar35 = vinsertps_avx(auVar82,ZEXT416((uint)(fVar130 * fVar335)),0x30);
              auVar82 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                      ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
              auVar292 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar132 * fVar335)),0x30);
              auVar81 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
              local_108 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar131 * fVar335)),0x30);
            }
            else {
              auVar292 = local_38;
              if (iVar4 == 0x9244) {
                lVar6 = plVar2[7];
                lVar22 = uVar18 * plVar2[9];
                auVar35 = *(undefined1 (*) [16])(lVar6 + lVar22);
                local_108 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                auVar292 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
                auVar114 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
              }
            }
            uVar23 = auVar80._0_4_;
            auVar112._4_4_ = uVar23;
            auVar112._0_4_ = uVar23;
            auVar112._8_4_ = uVar23;
            auVar112._12_4_ = uVar23;
            local_328 = vshufps_avx(auVar80,auVar80,0x55);
            _local_378 = vshufps_avx(auVar80,auVar80,0xaa);
            local_368._4_4_ = auVar56._0_4_;
            local_368._0_4_ = local_368._4_4_;
            fStack_360 = (float)local_368._4_4_;
            fStack_35c = (float)local_368._4_4_;
            _local_358 = vshufps_avx(auVar56,auVar56,0x55);
            _local_318 = vshufps_avx(auVar56,auVar56,0xaa);
            local_398._4_4_ = auVar33._0_4_;
            local_398._0_4_ = local_398._4_4_;
            fStack_390 = (float)local_398._4_4_;
            fStack_38c = (float)local_398._4_4_;
            _local_308 = vshufps_avx(auVar33,auVar33,0x55);
            local_2e8 = vshufps_avx(auVar33,auVar33,0xaa);
            local_2c8._4_4_ = auVar34._0_4_;
            local_2c8._0_4_ = local_2c8._4_4_;
            uStack_2c0._0_4_ = (float)local_2c8._4_4_;
            uStack_2c0._4_4_ = (float)local_2c8._4_4_;
            _local_388 = vshufps_avx(auVar34,auVar34,0x55);
            local_2d8 = vshufps_avx(auVar34,auVar34,0xaa);
            uVar23 = auVar35._0_4_;
            auVar270._4_4_ = uVar23;
            auVar270._0_4_ = uVar23;
            auVar270._8_4_ = uVar23;
            auVar270._12_4_ = uVar23;
            auVar81 = vshufps_avx(auVar35,auVar35,0x55);
            auVar82 = vshufps_avx(auVar35,auVar35,0xaa);
            uVar23 = local_108._0_4_;
            auVar214._4_4_ = uVar23;
            auVar214._0_4_ = uVar23;
            auVar214._8_4_ = uVar23;
            auVar214._12_4_ = uVar23;
            auVar83 = vshufps_avx(local_108,local_108,0x55);
            auVar84 = vshufps_avx(local_108,local_108,0xaa);
            uVar23 = auVar292._0_4_;
            auVar150._4_4_ = uVar23;
            auVar150._0_4_ = uVar23;
            auVar150._8_4_ = uVar23;
            auVar150._12_4_ = uVar23;
            auVar253 = vshufps_avx(auVar292,auVar292,0x55);
            auVar80 = vshufps_avx(auVar292,auVar292,0xaa);
            uVar23 = auVar114._0_4_;
            auVar260._4_4_ = uVar23;
            auVar260._0_4_ = uVar23;
            auVar260._8_4_ = uVar23;
            auVar260._12_4_ = uVar23;
            auVar56 = vshufps_avx(auVar114,auVar114,0x55);
            auVar35 = vshufps_avx(auVar114,auVar114,0xaa);
          }
          else {
            auVar33 = local_38;
            do {
              auVar34 = _local_348;
              uVar3 = 0;
              for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar3 = uVar3 + 1;
              }
              iVar4 = *(int *)(local_108 + (ulong)uVar3 * 4);
              auVar300._4_4_ = iVar4;
              auVar300._0_4_ = iVar4;
              auVar300._8_4_ = iVar4;
              auVar300._12_4_ = iVar4;
              auVar35 = vpcmpeqd_avx(auVar300,local_108);
              auVar35 = vpand_avx(auVar35,auVar33);
              plVar2 = (long *)(*(long *)&pGVar19[1].fnumTimeSegments + (long)iVar4 * 0x38);
              iVar4 = *(int *)(*(long *)&pGVar19[1].fnumTimeSegments + 0x20 + (long)iVar4 * 0x38);
              if (iVar4 == 0x9134) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
                local_a8 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
                local_b8 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
                local_d8 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
                auVar114 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
                local_c8 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
              }
              else if (iVar4 == 0x9234) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar301._8_8_ = 0;
                auVar301._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar301,0x4c);
                local_a8 = vshufps_avx(auVar114,auVar114,0x78);
                auVar302._8_8_ = 0;
                auVar302._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar302,0x4c);
                local_b8 = vshufps_avx(auVar114,auVar114,0x78);
                auVar303._8_8_ = 0;
                auVar303._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar303,0x4c);
                local_d8 = vshufps_avx(auVar114,auVar114,0x78);
                auVar304._8_8_ = 0;
                auVar304._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
                auVar114 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar304,0x4c);
                local_c8 = vshufps_avx(auVar114,auVar114,0x78);
              }
              else if (iVar4 == 0xb001) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                auVar305._8_8_ = 0;
                auVar305._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar114 = vinsertps_avx(auVar305,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
                auVar306._8_8_ = 0;
                auVar306._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
                auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar306);
                auVar82 = vshufps_avx(auVar81,auVar306,0xd8);
                auVar307._8_8_ = 0;
                auVar307._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar307);
                auVar83 = vshufps_avx(auVar81,auVar307,0xd8);
                fVar102 = *(float *)(lVar6 + 0x24 + lVar22);
                fVar130 = *(float *)(lVar6 + 0x28 + lVar22);
                fVar131 = *(float *)(lVar6 + 0x2c + lVar22);
                fVar132 = *(float *)(lVar6 + 0x30 + lVar22);
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),ZEXT416((uint)fVar102),
                                          ZEXT416((uint)fVar102));
                auVar81 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar131),ZEXT416((uint)fVar131));
                auVar84 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
                auVar81 = vrsqrtss_avx(auVar84,auVar84);
                fVar335 = auVar81._0_4_;
                fVar335 = fVar335 * fVar335 * fVar335 * auVar84._0_4_ * -0.5 + fVar335 * 1.5;
                local_c8 = vinsertps_avx(auVar83,ZEXT416((uint)(fVar102 * fVar335)),0x30);
                local_a8 = vinsertps_avx(auVar82,ZEXT416((uint)(fVar335 * fVar130)),0x30);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
                local_d8 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar335 * fVar132)),0x30);
                auVar114 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
                local_b8 = vinsertps_avx(auVar114,ZEXT416((uint)(fVar131 * fVar335)),0x30);
              }
              else if (iVar4 == 0x9244) {
                lVar6 = *plVar2;
                lVar22 = plVar2[2] * uVar18;
                local_a8 = *(undefined1 (*) [16])(lVar6 + lVar22);
                local_b8 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                local_d8 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
                local_c8 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
              }
              auVar33 = auVar33 ^ auVar35;
              local_348._4_4_ = local_a8._0_4_;
              local_348._0_4_ = local_348._4_4_;
              fStack_340 = (float)local_348._4_4_;
              fStack_33c = (float)local_348._4_4_;
              auVar114 = vshufps_avx(local_a8,local_a8,0x55);
              auVar81 = vshufps_avx(local_a8,local_a8,0xaa);
              local_1f8._4_4_ = local_b8._0_4_;
              local_1f8._0_4_ = local_1f8._4_4_;
              fStack_1f0 = (float)local_1f8._4_4_;
              fStack_1ec = (float)local_1f8._4_4_;
              auVar82 = vshufps_avx(local_b8,local_b8,0x55);
              auVar83 = vshufps_avx(local_b8,local_b8,0xaa);
              local_228._4_4_ = local_d8._0_4_;
              local_228._0_4_ = local_228._4_4_;
              local_228._8_4_ = local_228._4_4_;
              local_228._12_4_ = local_228._4_4_;
              auVar84 = vshufps_avx(local_d8,local_d8,0x55);
              local_98 = vshufps_avx(local_d8,local_d8,0xaa);
              local_148._4_4_ = local_c8._0_4_;
              local_78 = vshufps_avx(local_c8,local_c8,0x55);
              local_88 = vshufps_avx(local_c8,local_c8,0xaa);
              iVar4 = (int)plVar2[0xb];
              local_148._0_4_ = local_148._4_4_;
              local_148._8_4_ = local_148._4_4_;
              local_148._12_4_ = local_148._4_4_;
              if (iVar4 == 0x9134) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),
                                        ZEXT416(*(uint *)(lVar6 + 0x10 + lVar22)),0x1c);
                auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar22)),0x28);
                auVar253 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x14 + lVar22)),0x1c);
                local_168 = vinsertps_avx(auVar253,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),0x28);
                auVar253 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),0x1c);
                local_188 = vinsertps_avx(auVar253,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar22)),0x28);
                auVar253 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),
                                         ZEXT416(*(uint *)(lVar6 + 0x1c + lVar22)),0x1c);
                local_178 = vinsertps_avx(auVar253,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar22)),0x28);
              }
              else if (iVar4 == 0x9234) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar308._8_8_ = 0;
                auVar308._0_8_ = *(ulong *)(lVar6 + 4 + lVar22);
                auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar308,0x4c);
                auVar34 = vshufps_avx(auVar34,auVar34,0x78);
                auVar309._8_8_ = 0;
                auVar309._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar253 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar22)),auVar309,0x4c);
                local_168 = vshufps_avx(auVar253,auVar253,0x78);
                auVar310._8_8_ = 0;
                auVar310._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar253 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar310,0x4c);
                local_188 = vshufps_avx(auVar253,auVar253,0x78);
                auVar311._8_8_ = 0;
                auVar311._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar22);
                auVar253 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar22)),auVar311,0x4c);
                local_178 = vshufps_avx(auVar253,auVar253,0x78);
              }
              else if (iVar4 == 0xb001) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar312._8_8_ = 0;
                auVar312._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar22);
                auVar253 = vinsertps_avx(auVar312,ZEXT416(*(uint *)(lVar6 + 8 + lVar22)),0x20);
                auVar313._8_8_ = 0;
                auVar313._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar22);
                local_e8 = ZEXT416(*(uint *)(lVar6 + 0xc + lVar22));
                auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar22)),auVar313);
                auVar292 = vshufps_avx(auVar34,auVar313,0xd8);
                auVar314._8_8_ = 0;
                auVar314._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar22);
                auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar22)),auVar314);
                auVar85 = vshufps_avx(auVar34,auVar314,0xd8);
                fVar102 = *(float *)(lVar6 + 0x24 + lVar22);
                fVar130 = *(float *)(lVar6 + 0x28 + lVar22);
                fVar131 = *(float *)(lVar6 + 0x2c + lVar22);
                fVar132 = *(float *)(lVar6 + 0x30 + lVar22);
                auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),ZEXT416((uint)fVar102),
                                          ZEXT416((uint)fVar102));
                auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar131),ZEXT416((uint)fVar131));
                auVar86 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar132),ZEXT416((uint)fVar132));
                auVar34 = vrsqrtss_avx(auVar86,auVar86);
                fVar335 = auVar34._0_4_;
                fVar335 = fVar335 * fVar335 * fVar335 * auVar86._0_4_ * -0.5 + fVar335 * 1.5;
                local_178 = vinsertps_avx(auVar85,ZEXT416((uint)(fVar335 * fVar102)),0x30);
                auVar34 = vinsertps_avx(auVar292,ZEXT416((uint)(fVar335 * fVar130)),0x30);
                auVar292 = vinsertps_avx(local_e8,ZEXT416(*(uint *)(lVar6 + 4 + lVar22)),0x10);
                local_188 = vinsertps_avx(auVar253,ZEXT416((uint)(fVar132 * fVar335)),0x30);
                auVar253 = vinsertps_avx(auVar292,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar22)),0x20);
                local_168 = vinsertps_avx(auVar253,ZEXT416((uint)(fVar131 * fVar335)),0x30);
              }
              else if (iVar4 == 0x9244) {
                lVar6 = plVar2[7];
                lVar22 = plVar2[9] * uVar18;
                auVar34 = *(undefined1 (*) [16])(lVar6 + lVar22);
                local_168 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar22);
                local_188 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar22);
                local_178 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar22);
              }
              auVar112 = vblendvps_avx(auVar112,_local_348,auVar35);
              local_328 = vblendvps_avx(local_328,auVar114,auVar35);
              _local_378 = vblendvps_avx(_local_378,auVar81,auVar35);
              _local_368 = vblendvps_avx(_local_368,_local_1f8,auVar35);
              _local_358 = vblendvps_avx(_local_358,auVar82,auVar35);
              _local_318 = vblendvps_avx(_local_318,auVar83,auVar35);
              _local_398 = vblendvps_avx(_local_398,local_228,auVar35);
              _local_308 = vblendvps_avx(_local_308,auVar84,auVar35);
              local_2e8 = vblendvps_avx(local_2e8,local_98,auVar35);
              _local_2c8 = vblendvps_avx(_local_2c8,local_148,auVar35);
              _local_388 = vblendvps_avx(_local_388,local_78,auVar35);
              local_2d8 = vblendvps_avx(local_2d8,local_88,auVar35);
              uVar23 = auVar34._0_4_;
              auVar315._4_4_ = uVar23;
              auVar315._0_4_ = uVar23;
              auVar315._8_4_ = uVar23;
              auVar315._12_4_ = uVar23;
              auVar270 = vblendvps_avx(in_ZMM10._0_16_,auVar315,auVar35);
              auVar114 = vshufps_avx(auVar34,auVar34,0x55);
              auVar81 = vblendvps_avx(in_ZMM8._0_16_,auVar114,auVar35);
              in_ZMM8 = ZEXT1664(auVar81);
              auVar114 = vshufps_avx(auVar34,auVar34,0xaa);
              auVar82 = vblendvps_avx(in_ZMM7._0_16_,auVar114,auVar35);
              in_ZMM7 = ZEXT1664(auVar82);
              uVar23 = local_168._0_4_;
              auVar316._4_4_ = uVar23;
              auVar316._0_4_ = uVar23;
              auVar316._8_4_ = uVar23;
              auVar316._12_4_ = uVar23;
              auVar214 = vblendvps_avx(in_ZMM6._0_16_,auVar316,auVar35);
              in_ZMM6 = ZEXT1664(auVar214);
              auVar114 = vshufps_avx(local_168,local_168,0x55);
              auVar83 = vblendvps_avx(in_ZMM5._0_16_,auVar114,auVar35);
              in_ZMM5 = ZEXT1664(auVar83);
              auVar114 = vshufps_avx(local_168,local_168,0xaa);
              auVar84 = vblendvps_avx(in_ZMM14._0_16_,auVar114,auVar35);
              in_ZMM14 = ZEXT1664(auVar84);
              uVar23 = local_188._0_4_;
              auVar317._4_4_ = uVar23;
              auVar317._0_4_ = uVar23;
              auVar317._8_4_ = uVar23;
              auVar317._12_4_ = uVar23;
              auVar150 = vblendvps_avx(in_ZMM4._0_16_,auVar317,auVar35);
              in_ZMM4 = ZEXT1664(auVar150);
              auVar114 = vshufps_avx(local_188,local_188,0x55);
              auVar253 = vblendvps_avx(in_ZMM15._0_16_,auVar114,auVar35);
              in_ZMM15 = ZEXT1664(auVar253);
              auVar114 = vshufps_avx(local_188,local_188,0xaa);
              auVar80 = vblendvps_avx(auVar80,auVar114,auVar35);
              uVar23 = local_178._0_4_;
              auVar318._4_4_ = uVar23;
              auVar318._0_4_ = uVar23;
              auVar318._8_4_ = uVar23;
              auVar318._12_4_ = uVar23;
              auVar260 = vblendvps_avx(in_ZMM9._0_16_,auVar318,auVar35);
              in_ZMM9 = ZEXT1664(auVar260);
              auVar114 = vshufps_avx(local_178,local_178,0x55);
              auVar56 = vblendvps_avx(auVar56,auVar114,auVar35);
              auVar114 = vshufps_avx(local_178,local_178,0xaa);
              auVar35 = vblendvps_avx(in_ZMM12._0_16_,auVar114,auVar35);
              in_ZMM12 = ZEXT1664(auVar35);
              in_ZMM10 = ZEXT1664(auVar270);
              uVar20 = vmovmskps_avx(auVar33);
              _local_348 = auVar34;
            } while (uVar20 != 0);
          }
          auVar286._8_4_ = 0x3f800000;
          auVar286._0_8_ = 0x3f8000003f800000;
          auVar286._12_4_ = 0x3f800000;
          auVar33 = vsubps_avx(auVar286,auVar79);
          fVar102 = auVar79._0_4_;
          auVar271._0_4_ = auVar270._0_4_ * fVar102;
          fVar130 = auVar79._4_4_;
          auVar271._4_4_ = auVar270._4_4_ * fVar130;
          fVar131 = auVar79._8_4_;
          auVar271._8_4_ = auVar270._8_4_ * fVar131;
          fVar132 = auVar79._12_4_;
          auVar271._12_4_ = auVar270._12_4_ * fVar132;
          auVar34 = vfmadd231ps_fma(auVar271,auVar33,auVar112);
          auVar113._0_4_ = auVar81._0_4_ * fVar102;
          auVar113._4_4_ = auVar81._4_4_ * fVar130;
          auVar113._8_4_ = auVar81._8_4_ * fVar131;
          auVar113._12_4_ = auVar81._12_4_ * fVar132;
          auVar114 = vfmadd231ps_fma(auVar113,auVar33,local_328);
          auVar247._0_4_ = fVar102 * auVar82._0_4_;
          auVar247._4_4_ = fVar130 * auVar82._4_4_;
          auVar247._8_4_ = fVar131 * auVar82._8_4_;
          auVar247._12_4_ = fVar132 * auVar82._12_4_;
          auVar79 = vfmadd231ps_fma(auVar247,auVar33,_local_378);
          auVar229._0_4_ = fVar102 * auVar214._0_4_;
          auVar229._4_4_ = fVar130 * auVar214._4_4_;
          auVar229._8_4_ = fVar131 * auVar214._8_4_;
          auVar229._12_4_ = fVar132 * auVar214._12_4_;
          auVar81 = vfmadd231ps_fma(auVar229,auVar33,_local_368);
          auVar215._0_4_ = fVar102 * auVar83._0_4_;
          auVar215._4_4_ = fVar130 * auVar83._4_4_;
          auVar215._8_4_ = fVar131 * auVar83._8_4_;
          auVar215._12_4_ = fVar132 * auVar83._12_4_;
          auVar82 = vfmadd231ps_fma(auVar215,auVar33,_local_358);
          auVar189._0_4_ = auVar84._0_4_ * fVar102;
          auVar189._4_4_ = auVar84._4_4_ * fVar130;
          auVar189._8_4_ = auVar84._8_4_ * fVar131;
          auVar189._12_4_ = auVar84._12_4_ * fVar132;
          auVar83 = vfmadd231ps_fma(auVar189,auVar33,_local_318);
          auVar151._0_4_ = fVar102 * auVar150._0_4_;
          auVar151._4_4_ = fVar130 * auVar150._4_4_;
          auVar151._8_4_ = fVar131 * auVar150._8_4_;
          auVar151._12_4_ = fVar132 * auVar150._12_4_;
          auVar84 = vfmadd231ps_fma(auVar151,auVar33,_local_398);
          auVar345._0_4_ = auVar253._0_4_ * fVar102;
          auVar345._4_4_ = auVar253._4_4_ * fVar130;
          auVar345._8_4_ = auVar253._8_4_ * fVar131;
          auVar345._12_4_ = auVar253._12_4_ * fVar132;
          auVar253 = vfmadd231ps_fma(auVar345,auVar33,_local_308);
          auVar336._0_4_ = fVar102 * auVar80._0_4_;
          auVar336._4_4_ = fVar130 * auVar80._4_4_;
          auVar336._8_4_ = fVar131 * auVar80._8_4_;
          auVar336._12_4_ = fVar132 * auVar80._12_4_;
          auVar80 = vfmadd231ps_fma(auVar336,auVar33,local_2e8);
          auVar261._0_4_ = auVar260._0_4_ * fVar102;
          auVar261._4_4_ = auVar260._4_4_ * fVar130;
          auVar261._8_4_ = auVar260._8_4_ * fVar131;
          auVar261._12_4_ = auVar260._12_4_ * fVar132;
          auVar287._0_4_ = fVar102 * auVar56._0_4_;
          auVar287._4_4_ = fVar130 * auVar56._4_4_;
          auVar287._8_4_ = fVar131 * auVar56._8_4_;
          auVar287._12_4_ = fVar132 * auVar56._12_4_;
          auVar298._0_4_ = auVar35._0_4_ * fVar102;
          auVar298._4_4_ = auVar35._4_4_ * fVar130;
          auVar298._8_4_ = auVar35._8_4_ * fVar131;
          auVar298._12_4_ = auVar35._12_4_ * fVar132;
          auVar35 = vfmadd231ps_fma(auVar261,auVar33,_local_2c8);
          auVar56 = vfmadd231ps_fma(auVar287,auVar33,_local_388);
          auVar292 = vfmadd231ps_fma(auVar298,auVar33,local_2d8);
          auVar31._0_4_ = auVar253._0_4_ * auVar83._0_4_;
          auVar31._4_4_ = auVar253._4_4_ * auVar83._4_4_;
          auVar31._8_4_ = auVar253._8_4_ * auVar83._8_4_;
          auVar31._12_4_ = auVar253._12_4_ * auVar83._12_4_;
          auVar85 = vfmsub231ps_fma(auVar31,auVar82,auVar80);
          auVar133._0_4_ = auVar80._0_4_ * auVar81._0_4_;
          auVar133._4_4_ = auVar80._4_4_ * auVar81._4_4_;
          auVar133._8_4_ = auVar80._8_4_ * auVar81._8_4_;
          auVar133._12_4_ = auVar80._12_4_ * auVar81._12_4_;
          auVar86 = vfmsub231ps_fma(auVar133,auVar83,auVar84);
          auVar328._0_4_ = auVar84._0_4_ * auVar82._0_4_;
          auVar328._4_4_ = auVar84._4_4_ * auVar82._4_4_;
          auVar328._8_4_ = auVar84._8_4_ * auVar82._8_4_;
          auVar328._12_4_ = auVar84._12_4_ * auVar82._12_4_;
          auVar87 = vfmsub231ps_fma(auVar328,auVar81,auVar253);
          fVar102 = auVar79._0_4_;
          auVar54._0_4_ = fVar102 * auVar84._0_4_;
          fVar130 = auVar79._4_4_;
          auVar54._4_4_ = fVar130 * auVar84._4_4_;
          fVar131 = auVar79._8_4_;
          auVar54._8_4_ = fVar131 * auVar84._8_4_;
          fVar132 = auVar79._12_4_;
          auVar54._12_4_ = fVar132 * auVar84._12_4_;
          auVar88 = vfmsub231ps_fma(auVar54,auVar34,auVar80);
          auVar337._0_4_ = auVar80._0_4_ * auVar114._0_4_;
          auVar337._4_4_ = auVar80._4_4_ * auVar114._4_4_;
          auVar337._8_4_ = auVar80._8_4_ * auVar114._8_4_;
          auVar337._12_4_ = auVar80._12_4_ * auVar114._12_4_;
          auVar80 = vfmsub231ps_fma(auVar337,auVar253,auVar79);
          auVar346._0_4_ = auVar34._0_4_ * auVar253._0_4_;
          auVar346._4_4_ = auVar34._4_4_ * auVar253._4_4_;
          auVar346._8_4_ = auVar34._8_4_ * auVar253._8_4_;
          auVar346._12_4_ = auVar34._12_4_ * auVar253._12_4_;
          auVar84 = vfmsub231ps_fma(auVar346,auVar114,auVar84);
          auVar152._0_4_ = fVar102 * auVar82._0_4_;
          auVar152._4_4_ = fVar130 * auVar82._4_4_;
          auVar152._8_4_ = fVar131 * auVar82._8_4_;
          auVar152._12_4_ = fVar132 * auVar82._12_4_;
          auVar253 = vfmsub231ps_fma(auVar152,auVar114,auVar83);
          auVar190._0_4_ = auVar34._0_4_ * auVar83._0_4_;
          auVar190._4_4_ = auVar34._4_4_ * auVar83._4_4_;
          auVar190._8_4_ = auVar34._8_4_ * auVar83._8_4_;
          auVar190._12_4_ = auVar34._12_4_ * auVar83._12_4_;
          auVar79 = vfmsub231ps_fma(auVar190,auVar79,auVar81);
          auVar230._0_4_ = auVar81._0_4_ * auVar114._0_4_;
          auVar230._4_4_ = auVar81._4_4_ * auVar114._4_4_;
          auVar230._8_4_ = auVar81._8_4_ * auVar114._8_4_;
          auVar230._12_4_ = auVar81._12_4_ * auVar114._12_4_;
          auVar81 = vfmsub231ps_fma(auVar230,auVar34,auVar82);
          auVar216._0_4_ = fVar102 * auVar87._0_4_;
          auVar216._4_4_ = fVar130 * auVar87._4_4_;
          auVar216._8_4_ = fVar131 * auVar87._8_4_;
          auVar216._12_4_ = fVar132 * auVar87._12_4_;
          auVar33 = vfmadd231ps_fma(auVar216,auVar86,auVar114);
          auVar34 = vfmadd231ps_fma(auVar33,auVar85,auVar34);
          auVar33 = vdivps_avx(auVar85,auVar34);
          _local_368 = vdivps_avx(auVar80,auVar34);
          _local_378 = vdivps_avx(auVar253,auVar34);
          _local_318 = vdivps_avx(auVar86,auVar34);
          _local_388 = vdivps_avx(auVar88,auVar34);
          _local_398 = vdivps_avx(auVar79,auVar34);
          local_328 = vdivps_avx(auVar87,auVar34);
          local_2e8 = vdivps_avx(auVar84,auVar34);
          local_2d8 = vdivps_avx(auVar81,auVar34);
          fVar102 = auVar292._0_4_;
          auVar191._0_4_ = fVar102 * local_328._0_4_;
          fVar130 = auVar292._4_4_;
          auVar191._4_4_ = fVar130 * local_328._4_4_;
          fVar131 = auVar292._8_4_;
          auVar191._8_4_ = fVar131 * local_328._8_4_;
          fVar132 = auVar292._12_4_;
          auVar191._12_4_ = fVar132 * local_328._12_4_;
          auVar231._0_4_ = fVar102 * local_2e8._0_4_;
          auVar231._4_4_ = fVar130 * local_2e8._4_4_;
          auVar231._8_4_ = fVar131 * local_2e8._8_4_;
          auVar231._12_4_ = fVar132 * local_2e8._12_4_;
          auVar299._0_4_ = fVar102 * local_2d8._0_4_;
          auVar299._4_4_ = fVar130 * local_2d8._4_4_;
          auVar299._8_4_ = fVar131 * local_2d8._8_4_;
          auVar299._12_4_ = fVar132 * local_2d8._12_4_;
          auVar34 = vfmadd231ps_fma(auVar191,auVar56,_local_318);
          auVar114 = vfmadd231ps_fma(auVar231,auVar56,_local_388);
          auVar56 = vfmadd231ps_fma(auVar299,_local_398,auVar56);
          auVar34 = vfmadd231ps_fma(auVar34,auVar35,auVar33);
          auVar114 = vfmadd231ps_fma(auVar114,auVar35,_local_368);
          auVar35 = vfmadd231ps_fma(auVar56,_local_378,auVar35);
          auVar288._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
          auVar288._8_4_ = auVar34._8_4_ ^ 0x80000000;
          auVar288._12_4_ = auVar34._12_4_ ^ 0x80000000;
          auVar272._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
          auVar272._8_4_ = auVar114._8_4_ ^ 0x80000000;
          auVar272._12_4_ = auVar114._12_4_ ^ 0x80000000;
          auVar262._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = auVar35._8_4_ ^ 0x80000000;
          auVar262._12_4_ = auVar35._12_4_ ^ 0x80000000;
        }
        auVar34 = *(undefined1 (*) [16])ray;
        auVar35 = *(undefined1 (*) [16])(ray + 0x10);
        auVar114 = *(undefined1 (*) [16])(ray + 0x20);
        auVar56 = vfmadd231ps_fma(auVar288,auVar114,local_328);
        auVar56 = vfmadd231ps_fma(auVar56,auVar35,_local_318);
        auVar80 = vfmadd231ps_fma(auVar56,auVar34,auVar33);
        auVar56 = *(undefined1 (*) [16])(ray + 0x40);
        auVar79 = *(undefined1 (*) [16])(ray + 0x50);
        pRVar1 = ray + 0x60;
        fVar102 = *(float *)pRVar1;
        fVar130 = *(float *)(ray + 100);
        fVar131 = *(float *)(ray + 0x68);
        auVar15 = *(undefined1 (*) [12])pRVar1;
        fVar132 = *(float *)(ray + 0x6c);
        auVar83 = *(undefined1 (*) [16])pRVar1;
        *(undefined1 (*) [16])ray = auVar80;
        auVar80 = vfmadd231ps_fma(auVar272,auVar114,local_2e8);
        auVar80 = vfmadd231ps_fma(auVar80,auVar35,_local_388);
        auVar80 = vfmadd231ps_fma(auVar80,auVar34,_local_368);
        *(undefined1 (*) [16])(ray + 0x10) = auVar80;
        auVar80 = vfmadd231ps_fma(auVar262,auVar114,local_2d8);
        auVar80 = vfmadd231ps_fma(auVar80,auVar35,_local_398);
        auVar80 = vfmadd231ps_fma(auVar80,auVar34,_local_378);
        *(undefined1 (*) [16])(ray + 0x20) = auVar80;
        auVar192._0_4_ = local_328._0_4_ * fVar102;
        auVar192._4_4_ = local_328._4_4_ * fVar130;
        auVar192._8_4_ = local_328._8_4_ * fVar131;
        auVar192._12_4_ = local_328._12_4_ * fVar132;
        auVar80 = vfmadd231ps_fma(auVar192,auVar79,_local_318);
        auVar32._0_4_ = local_2e8._0_4_ * fVar102;
        auVar32._4_4_ = local_2e8._4_4_ * fVar130;
        auVar32._8_4_ = local_2e8._8_4_ * fVar131;
        auVar32._12_4_ = local_2e8._12_4_ * fVar132;
        auVar81 = vfmadd231ps_fma(auVar32,auVar79,_local_388);
        auVar55._0_4_ = local_2d8._0_4_ * fVar102;
        auVar55._4_4_ = local_2d8._4_4_ * fVar130;
        auVar55._8_4_ = local_2d8._8_4_ * fVar131;
        auVar55._12_4_ = local_2d8._12_4_ * fVar132;
        auVar82 = vfmadd231ps_fma(auVar55,auVar79,_local_398);
        auVar33 = vfmadd231ps_fma(auVar80,auVar56,auVar33);
        auVar80 = vfmadd231ps_fma(auVar81,auVar56,_local_368);
        auVar81 = vfmadd231ps_fma(auVar82,auVar56,_local_378);
        *(undefined1 (*) [16])(ray + 0x40) = auVar33;
        *(undefined1 (*) [16])(ray + 0x50) = auVar80;
        *(undefined1 (*) [16])(ray + 0x60) = auVar81;
        local_f8 = context->args;
        local_28 = local_38._0_8_;
        uStack_20 = local_38._8_8_;
        local_108._8_8_ = pRVar5;
        local_108._0_8_ = p_Var17;
        local_38 = auVar53;
        (**(code **)(p_Var17 + 0xa0))(&local_28,p_Var17 + 0x58,ray);
        local_2c8 = auVar34._0_8_;
        uStack_2c0 = auVar34._8_8_;
        *(undefined1 (*) [8])ray = local_2c8;
        *(undefined8 *)(ray + 8) = uStack_2c0;
        local_328._0_8_ = auVar35._0_8_;
        local_328._8_8_ = auVar35._8_8_;
        *(undefined8 *)(ray + 0x10) = local_328._0_8_;
        *(undefined8 *)(ray + 0x18) = local_328._8_8_;
        local_318 = auVar114._0_8_;
        uStack_310 = auVar114._8_8_;
        *(undefined1 (*) [8])(ray + 0x20) = local_318;
        *(undefined8 *)(ray + 0x28) = uStack_310;
        local_338 = auVar56._0_8_;
        uStack_330 = auVar56._8_8_;
        *(undefined1 (*) [8])(ray + 0x40) = local_338;
        *(undefined8 *)(ray + 0x48) = uStack_330;
        local_358 = auVar79._0_8_;
        uStack_350 = auVar79._8_8_;
        *(undefined1 (*) [8])(ray + 0x50) = local_358;
        *(undefined8 *)(ray + 0x58) = uStack_350;
        local_308 = auVar15._0_8_;
        uStack_300 = auVar83._8_8_;
        *(undefined1 (*) [8])(ray + 0x60) = local_308;
        *(undefined8 *)(ray + 0x68) = uStack_300;
        auVar33 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
        *(undefined1 (*) [16])this = auVar33;
        pRVar5->instID[0] = 0xffffffff;
        pRVar5->instPrimID[0] = 0xffffffff;
        pGVar19 = extraout_RDX;
      }
      goto LAB_0066d87d;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar16;
LAB_0066d87d:
  vVar353.field_0._8_8_ = pGVar19;
  vVar353.field_0._0_8_ = this;
  return (vbool<4>)vVar353.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }